

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O0

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::DuplicateColsPS::execute
          (DuplicateColsPS *this,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *param_3,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *param_4,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *r,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *cStatus,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   *rStatus,bool isOptimal)

{
  type_conflict5 tVar1;
  bool bVar2;
  int *piVar3;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar4;
  VarStatus *pVVar5;
  undefined8 uVar6;
  ulong *puVar7;
  VarStatus VVar8;
  long *in_RDI;
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  *in_R9;
  byte in_stack_00000010;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  z2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  z1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  scale2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  scale1;
  int cIdx;
  int cIdx_new;
  int i;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_42;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_42;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_35;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_35;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_22;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_22;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_15;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_15;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_4;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_3;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_3;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_46;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_46;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_45;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_45;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_43;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_43;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_41;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_41;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_39;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_39;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_38;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_38;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_36;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_36;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_34;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_34;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_32;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_32;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_31;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_31;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_29;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_29;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_28;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_28;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_26;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_26;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_25;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_25;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_23;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_23;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_21;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_21;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_19;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_19;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_18;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_18;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_16;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_16;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_14;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_14;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_12;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_12;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_11;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_11;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_9;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_6;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_6;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_5;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_5;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_44;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_44;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_40;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_40;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_37;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_37;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_33;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_33;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_30;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_30;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_27;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_27;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_24;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_24;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_20;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_20;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_17;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_17;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_13;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_13;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_10;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_10;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_7;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_7;
  undefined4 in_stack_ffffffffffffcf88;
  int in_stack_ffffffffffffcf8c;
  cpp_dec_float<50U,_int,_void> *in_stack_ffffffffffffcf90;
  cpp_dec_float<50U,_int,_void> *this_00;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffcf98;
  cpp_dec_float<50U,_int,_void> *in_stack_ffffffffffffcfa0;
  allocator *paVar9;
  undefined4 in_stack_ffffffffffffcfa8;
  undefined4 in_stack_ffffffffffffcfac;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffcfb0;
  type_conflict5 local_3015;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffcff8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffd000;
  undefined4 in_stack_ffffffffffffd010;
  undefined4 in_stack_ffffffffffffd014;
  cpp_dec_float<50U,_int,_void> *in_stack_ffffffffffffd018;
  long *plVar10;
  type_conflict5 local_2fcd;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffd040;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffd048;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffd050;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar11;
  type_conflict5 local_2fa5;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffd070;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffd078;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffd080;
  undefined4 in_stack_ffffffffffffd088;
  undefined4 in_stack_ffffffffffffd08c;
  type_conflict5 local_2f35;
  type_conflict5 local_2f0d;
  type_conflict5 local_2eed;
  type_conflict5 local_2ec5;
  type_conflict5 local_2e81;
  bool local_2e6a;
  bool local_2e69;
  bool local_2e52;
  bool local_2e51;
  undefined1 local_2dd4 [58];
  undefined1 local_2d9a;
  allocator local_2d99;
  string local_2d98 [32];
  undefined1 local_2d78 [56];
  undefined1 local_2d40 [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2d08;
  undefined1 local_2cd0 [56];
  undefined1 local_2c98 [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2c60;
  undefined1 local_2c28 [56];
  ulong local_2bf0;
  undefined1 local_2be8 [56];
  undefined1 local_2bb0 [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b78;
  undefined1 local_2b40 [56];
  undefined1 local_2b08 [56];
  undefined1 local_2ad0 [56];
  undefined1 local_2a98 [56];
  undefined1 local_2a60 [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2a28;
  undefined1 local_29f0 [56];
  undefined1 local_29b8 [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2980;
  undefined1 local_2948 [56];
  undefined1 local_2910 [56];
  undefined1 local_28d8 [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_28a0;
  undefined1 local_2868 [56];
  undefined1 local_2830 [56];
  undefined1 local_27f8 [56];
  ulong local_27c0;
  undefined1 local_27b4 [56];
  undefined1 local_277c [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2744;
  undefined1 local_270c [56];
  undefined1 local_26d4 [56];
  undefined1 local_269c [56];
  undefined1 local_2664 [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_262c;
  undefined1 local_25f4 [56];
  undefined1 local_25bc [58];
  undefined1 local_2582;
  allocator local_2581;
  string local_2580 [32];
  undefined1 local_2560 [56];
  undefined1 local_2528 [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_24f0;
  undefined1 local_24b8 [56];
  undefined1 local_2480 [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2448;
  undefined1 local_2410 [56];
  ulong local_23d8;
  undefined1 local_23d0 [56];
  undefined1 local_2398 [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2360;
  undefined1 local_2328 [56];
  undefined1 local_22f0 [56];
  undefined1 local_22b8 [56];
  ulong local_2280;
  undefined1 local_2278 [56];
  undefined1 local_2240 [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2208;
  undefined1 local_21d0 [56];
  undefined1 local_2198 [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2160;
  undefined1 local_2128 [56];
  undefined1 local_20f0 [56];
  undefined1 local_20b8 [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2080;
  undefined1 local_2048 [56];
  undefined1 local_2010 [56];
  undefined1 local_1fd8 [56];
  undefined1 local_1fa0 [56];
  undefined1 local_1f68 [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1f30;
  undefined1 local_1ef8 [56];
  undefined1 local_1ec0 [56];
  undefined1 local_1e88 [56];
  undefined1 local_1e50 [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1e18;
  undefined1 local_1de0 [56];
  undefined1 local_1da8 [56];
  undefined8 local_1d70;
  undefined8 local_1d68;
  undefined1 local_1d60 [56];
  ulong local_1d28;
  undefined1 local_1d20 [56];
  undefined1 local_1ce8 [56];
  ulong local_1cb0;
  undefined1 local_1ca8 [56];
  undefined8 local_1c70;
  undefined1 local_1c68 [56];
  undefined1 local_1c30 [56];
  undefined8 local_1bf8;
  undefined1 local_1bf0 [56];
  undefined1 local_1bb8 [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b80;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b48;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b10;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1ad8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1aa0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1a68;
  undefined8 local_1a30;
  undefined8 local_1a28;
  undefined8 local_1a20;
  undefined8 local_1a18;
  undefined1 local_1a0c [56];
  undefined1 local_19d4 [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_199c;
  undefined1 local_1964 [56];
  undefined1 local_192c [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_18f4;
  undefined1 local_18ba;
  allocator local_18b9;
  string local_18b8 [32];
  undefined1 local_1898 [56];
  undefined8 local_1860;
  undefined1 local_1858 [56];
  undefined1 local_1820 [56];
  undefined1 local_17e8 [56];
  undefined8 local_17b0;
  undefined1 local_17a8 [56];
  undefined1 local_1770 [56];
  undefined1 local_1738 [56];
  undefined1 local_1700 [56];
  undefined1 local_16c8 [56];
  undefined1 local_1690 [56];
  undefined1 local_1658 [56];
  undefined1 local_1620 [56];
  undefined1 local_15e8 [56];
  undefined1 local_15b0 [56];
  undefined8 local_1578;
  undefined1 local_156d;
  allocator local_1559;
  string local_1558 [32];
  undefined1 local_1538 [56];
  undefined8 local_1500;
  undefined1 local_14f8 [56];
  undefined1 local_14c0 [56];
  undefined1 local_1488 [56];
  undefined8 local_1450;
  undefined1 local_1448 [56];
  undefined1 local_1410 [56];
  undefined1 local_13d8 [56];
  undefined1 local_13a0 [56];
  undefined1 local_1368 [56];
  undefined1 local_1330 [56];
  undefined1 local_12f8 [56];
  undefined1 local_12c0 [56];
  undefined1 local_1288 [56];
  undefined1 local_1250 [56];
  undefined4 local_1218;
  undefined4 local_1214;
  int local_1210;
  int local_120c;
  int local_1208;
  byte local_1201;
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  *local_1200;
  undefined8 local_11d0;
  undefined8 *local_11c8;
  undefined1 *local_11c0;
  undefined8 local_11b8;
  undefined8 *local_11b0;
  undefined1 *local_11a8;
  undefined8 local_11a0;
  undefined8 *local_1198;
  undefined1 *local_1190;
  undefined8 local_1188;
  undefined8 *local_1180;
  undefined1 *local_1178;
  undefined8 local_1170;
  ulong *local_1168;
  undefined1 *local_1160;
  undefined8 local_1158;
  undefined8 local_1150;
  undefined1 *local_1148;
  undefined8 local_1140;
  ulong *local_1138;
  undefined1 *local_1130;
  undefined8 local_1128;
  undefined8 local_1120;
  undefined1 *local_1118;
  undefined8 local_1110;
  undefined8 local_1108;
  undefined1 *local_1100;
  undefined8 local_10f8;
  undefined8 local_10f0;
  undefined1 *local_10e8;
  undefined8 local_10e0;
  ulong *local_10d8;
  undefined1 *local_10d0;
  undefined8 local_10c8;
  ulong *local_10c0;
  undefined1 *local_10b8;
  undefined8 local_10b0;
  ulong *local_10a8;
  undefined1 *local_10a0;
  undefined8 local_1098;
  undefined8 local_1090;
  undefined1 *local_1088;
  undefined8 local_1080;
  undefined8 local_1078;
  undefined1 *local_1070;
  undefined8 local_1068;
  ulong *local_1060;
  undefined1 *local_1058;
  long *local_1050;
  undefined1 *local_1048;
  long *local_1040;
  undefined1 *local_1038;
  long *local_1030;
  undefined1 *local_1028;
  long *local_1020;
  undefined1 *local_1018;
  long *local_1010;
  undefined1 *local_1008;
  long *local_1000;
  undefined1 *local_ff8;
  long *local_ff0;
  undefined1 *local_fe8;
  long *local_fe0;
  undefined1 *local_fd8;
  long *local_fd0;
  undefined1 *local_fc8;
  long *local_fc0;
  undefined1 *local_fb8;
  long *local_fb0;
  undefined1 *local_fa8;
  long *local_fa0;
  undefined1 *local_f98;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f90;
  undefined1 *local_f88;
  long *local_f80;
  undefined1 *local_f78;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f70;
  undefined1 *local_f68;
  long *local_f60;
  undefined1 *local_f58;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f50;
  undefined1 *local_f48;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f40;
  undefined1 *local_f38;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f30;
  undefined1 *local_f28;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f20;
  undefined1 *local_f18;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f10;
  undefined1 *local_f08;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f00;
  undefined1 *local_ef8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_ef0;
  undefined1 *local_ee8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_ee0;
  undefined1 *local_ed8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_ed0;
  undefined1 *local_ec8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_ec0;
  undefined1 *local_eb8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_eb0;
  undefined1 *local_ea8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_ea0;
  undefined1 *local_e98;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e90;
  undefined1 *local_e88;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e80;
  undefined1 *local_e78;
  undefined1 *local_e70;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e68;
  undefined1 *local_e60;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e58;
  undefined1 *local_e50;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e48;
  undefined1 *local_e40;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e38;
  undefined1 *local_e30;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e28;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e20;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e18;
  long *local_e10;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e08;
  long *local_e00;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_df8;
  long *local_df0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_de8;
  long *local_de0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_dd8;
  long *local_dd0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_dc8;
  long *local_dc0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_db8;
  long *local_db0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_da8;
  long *local_da0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d98;
  long *local_d90;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d88;
  long *local_d80;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d78;
  long *local_d70;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d68;
  long *local_d60;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d58;
  long *local_d50;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d48;
  long *local_d40;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d38;
  long *local_d30;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d28;
  long *local_d20;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d18;
  long *local_d10;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d08;
  long *local_d00;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_cf8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_cf0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_ce8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_ce0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_cd8;
  ulong *local_cd0;
  undefined8 local_cc8;
  undefined8 local_cc0;
  ulong *local_cb8;
  ulong *local_cb0;
  ulong *local_ca8;
  undefined8 local_ca0;
  undefined8 local_c98;
  undefined8 local_c90;
  ulong *local_c88;
  undefined8 local_c80;
  ulong *local_c78;
  undefined8 *local_c70;
  undefined8 *local_c68;
  undefined8 *local_c60;
  undefined8 *local_c58;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_c49;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c48;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c40;
  undefined1 *local_c38;
  undefined1 *local_c30;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c28;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c20;
  undefined1 *local_c18;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_c09;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c08;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c00;
  undefined1 *local_bf8;
  undefined1 *local_bf0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_be8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_be0;
  undefined1 *local_bd8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_bc9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_bc8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_bc0;
  undefined1 *local_bb8;
  undefined1 *local_bb0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_ba8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_ba0;
  undefined1 *local_b98;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_b89;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b88;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b80;
  undefined1 *local_b78;
  undefined1 *local_b70;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b68;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b60;
  undefined1 *local_b58;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_b49;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b48;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b40;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b38;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b30;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b28;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b20;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b18;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_b09;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b08;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b00;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_af8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_af0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_ae8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_ae0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_ad8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_ac9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_ac8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_ac0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_ab8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_ab0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_aa8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_aa0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a98;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_a89;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a88;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a80;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a78;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a70;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a68;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a60;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a58;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_a49;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a48;
  cpp_dec_float<50U,_int,_void> *local_a40;
  undefined1 *local_a38;
  undefined1 *local_a30;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a28;
  cpp_dec_float<50U,_int,_void> *local_a20;
  undefined1 *local_a18;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_a09;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a08;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a00;
  undefined1 *local_9f8;
  undefined1 *local_9f0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_9e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_9e0;
  undefined1 *local_9d8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_9c9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_9c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_9c0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_9b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_9b0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_9a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_9a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_998;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_989;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_988;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_980;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_978;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_970;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_968;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_960;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_958;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_949;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_948;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_940;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_938;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_930;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_928;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_920;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_918;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_909;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_908;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_900;
  undefined1 *local_8f8;
  undefined1 *local_8f0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_8e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_8e0;
  undefined1 *local_8d8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_8c9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_8c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_8c0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_8b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_8b0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_8a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_8a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_898;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_889;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_888;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_880;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_878;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_870;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_868;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_860;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_858;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_849;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_848;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_840;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_838;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_830;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_828;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_820;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_818;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_809;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_808;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_800;
  undefined1 *local_7f8;
  undefined1 *local_7f0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_7e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_7e0;
  undefined1 *local_7d8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_7c9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_7c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_7c0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_7b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_7b0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_7a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_7a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_798;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_789;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_788;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_780;
  undefined1 *local_778;
  undefined1 *local_770;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_768;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_760;
  undefined1 *local_758;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_749;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_748;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_740;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_738;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_730;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_728;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_720;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_718;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_709;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_708;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_700;
  undefined1 *local_6f8;
  undefined1 *local_6f0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_6e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_6e0;
  undefined1 *local_6d8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_6c9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_6c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_6c0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_6b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_6b0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_6a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_6a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_698;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_689;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_688;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_680;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_678;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_670;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_668;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_660;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_658;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_649;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_648;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_640;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_638;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_630;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_628;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_620;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_618;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_609;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_608;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_600;
  undefined1 *local_5f8;
  undefined1 *local_5f0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_5e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_5e0;
  undefined1 *local_5d8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_5c9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_5c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_5c0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_5b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_5b0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_5a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_5a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_598;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_589;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_588;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_580;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_578;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_570;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_568;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_560;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_558;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_549;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_548;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_540;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_538;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_530;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_528;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_520;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_518;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_509;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_508;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_500;
  undefined1 *local_4f8;
  undefined1 *local_4f0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4e0;
  undefined1 *local_4d8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_4c9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4c0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4b0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_498;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_489;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_488;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_480;
  undefined1 *local_478;
  undefined1 *local_470;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_468;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_460;
  undefined1 *local_458;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_449;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_448;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_440;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_438;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_430;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_428;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_420;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_418;
  undefined8 *local_410;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_408;
  undefined8 *local_400;
  undefined8 *local_3f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3f0;
  undefined8 *local_3e8;
  undefined8 *local_3e0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3d8;
  undefined8 *local_3d0;
  undefined8 *local_3c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3c0;
  undefined8 *local_3b8;
  undefined8 *local_3b0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3a8;
  undefined8 *local_3a0;
  undefined8 *local_398;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_390;
  undefined8 *local_388;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_379;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_378;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_370;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_368;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_360;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_358;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_350;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_348;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_339;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_338;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_330;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_328;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_320;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_318;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_310;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_308;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_2f9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2f0;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2d0;
  undefined1 *local_2c8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_2b9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_298;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_290;
  undefined1 *local_288;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_279;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_278;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_258;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_250;
  undefined1 *local_248;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_239;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_238;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_218;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_210;
  undefined1 *local_208;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_1f9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1d0;
  undefined1 *local_1c8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_1b9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_198;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_190;
  undefined1 *local_188;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_179;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_178;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_158;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_150;
  undefined1 *local_148;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_139;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_138;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_118;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_110;
  undefined1 *local_108;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_f9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d0;
  undefined1 *local_c8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_b9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_98;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_90;
  undefined1 *local_88;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_79;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_50;
  undefined1 *local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  undefined1 *local_8;
  
  local_1201 = in_stack_00000010 & 1;
  if ((*(byte *)(in_RDI + 0x29) & 1) == 0) {
    local_1200 = in_R9;
    if ((*(byte *)((long)in_RDI + 0x149) & 1) == 0) {
      pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
               ::operator[](in_R9,*(int *)((long)in_RDI + 0x2c));
      if (*pVVar5 == ON_LOWER) {
        local_cf8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)in_stack_ffffffffffffcf90,in_stack_ffffffffffffcf8c);
        local_d00 = in_RDI + 0x14;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (in_stack_ffffffffffffcf90,
                   (cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88));
        local_1214 = 0;
        tVar1 = boost::multiprecision::operator>
                          (in_stack_ffffffffffffcf98,(int *)in_stack_ffffffffffffcf90);
        if (tVar1) {
          local_d08 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)in_stack_ffffffffffffcf90,in_stack_ffffffffffffcf8c);
          local_d10 = in_RDI + 6;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    (in_stack_ffffffffffffcf90,
                     (cpp_dec_float<50U,_int,_void> *)
                     CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88));
          bVar2 = boost::multiprecision::operator==
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88),
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x40c2e5);
          VVar8 = ON_LOWER;
          if (bVar2) {
            VVar8 = FIXED;
          }
          pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   ::operator[](local_1200,(int)in_RDI[5]);
          *pVVar5 = VVar8;
        }
        else {
          local_d18 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)in_stack_ffffffffffffcf90,in_stack_ffffffffffffcf8c);
          local_d20 = in_RDI + 0xd;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    (in_stack_ffffffffffffcf90,
                     (cpp_dec_float<50U,_int,_void> *)
                     CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88));
          bVar2 = boost::multiprecision::operator==
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88),
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x40c395);
          VVar8 = ON_UPPER;
          if (bVar2) {
            VVar8 = FIXED;
          }
          pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   ::operator[](local_1200,(int)in_RDI[5]);
          *pVVar5 = VVar8;
        }
      }
      else {
        pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                 ::operator[](local_1200,*(int *)((long)in_RDI + 0x2c));
        if (*pVVar5 == ON_UPPER) {
          local_d28 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)in_stack_ffffffffffffcf90,in_stack_ffffffffffffcf8c);
          local_d30 = in_RDI + 0x1b;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    (in_stack_ffffffffffffcf90,
                     (cpp_dec_float<50U,_int,_void> *)
                     CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88));
          local_1218 = 0;
          tVar1 = boost::multiprecision::operator>
                            (in_stack_ffffffffffffcf98,(int *)in_stack_ffffffffffffcf90);
          if (tVar1) {
            local_d38 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)in_stack_ffffffffffffcf90,in_stack_ffffffffffffcf8c);
            local_d40 = in_RDI + 0xd;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                      (in_stack_ffffffffffffcf90,
                       (cpp_dec_float<50U,_int,_void> *)
                       CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88));
            bVar2 = boost::multiprecision::operator==
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88),
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)0x40c4ed);
            VVar8 = ON_UPPER;
            if (bVar2) {
              VVar8 = FIXED;
            }
            pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                     ::operator[](local_1200,(int)in_RDI[5]);
            *pVVar5 = VVar8;
          }
          else {
            local_d48 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)in_stack_ffffffffffffcf90,in_stack_ffffffffffffcf8c);
            local_d50 = in_RDI + 6;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                      (in_stack_ffffffffffffcf90,
                       (cpp_dec_float<50U,_int,_void> *)
                       CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88));
            bVar2 = boost::multiprecision::operator==
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88),
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)0x40c59a);
            VVar8 = ON_LOWER;
            if (bVar2) {
              VVar8 = FIXED;
            }
            pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                     ::operator[](local_1200,(int)in_RDI[5]);
            *pVVar5 = VVar8;
          }
        }
        else {
          pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   ::operator[](local_1200,*(int *)((long)in_RDI + 0x2c));
          if (*pVVar5 == FIXED) {
            local_d58 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)in_stack_ffffffffffffcf90,in_stack_ffffffffffffcf8c);
            local_d60 = in_RDI + 6;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                      (in_stack_ffffffffffffcf90,
                       (cpp_dec_float<50U,_int,_void> *)
                       CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88));
            pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                     ::operator[](local_1200,(int)in_RDI[5]);
            *pVVar5 = FIXED;
          }
          else {
            pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                     ::operator[](local_1200,*(int *)((long)in_RDI + 0x2c));
            if (*pVVar5 == ZERO) {
              local_1050 = in_RDI + 0x14;
              local_1048 = local_1250;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                        (in_stack_ffffffffffffcf90,
                         (cpp_dec_float<50U,_int,_void> *)
                         CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88));
              (**(code **)(*in_RDI + 0x38))(local_1288);
              bVar2 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                (in_stack_ffffffffffffd000,in_stack_ffffffffffffcff8);
              local_2e51 = false;
              if (bVar2) {
                local_1040 = in_RDI + 0x1b;
                local_1038 = local_12c0;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                          (in_stack_ffffffffffffcf90,
                           (cpp_dec_float<50U,_int,_void> *)
                           CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88));
                (**(code **)(*in_RDI + 0x38))(local_12f8);
                bVar2 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                  (in_stack_ffffffffffffd000,in_stack_ffffffffffffcff8);
                local_2e51 = false;
                if (bVar2) {
                  local_2e51 = boost::multiprecision::operator==
                                         ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                           *)CONCAT44(in_stack_ffffffffffffcf8c,
                                                      in_stack_ffffffffffffcf88),
                                          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                           *)0x40c7a4);
                }
              }
              if (local_2e51 == false) {
                local_1030 = in_RDI + 0x14;
                local_1028 = local_1330;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                          (in_stack_ffffffffffffcf90,
                           (cpp_dec_float<50U,_int,_void> *)
                           CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88));
                (**(code **)(*in_RDI + 0x38))(local_1368);
                bVar2 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                  (in_stack_ffffffffffffd000,in_stack_ffffffffffffcff8);
                if (bVar2) {
                  pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                           ::operator[](local_1200,*(int *)((long)in_RDI + 0x2c));
                  *pVVar5 = ON_LOWER;
                }
                else {
                  local_1020 = in_RDI + 0x1b;
                  local_1018 = local_13a0;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                            (in_stack_ffffffffffffcf90,
                             (cpp_dec_float<50U,_int,_void> *)
                             CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88));
                  (**(code **)(*in_RDI + 0x38))(local_13d8);
                  bVar2 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                    (in_stack_ffffffffffffd000,in_stack_ffffffffffffcff8);
                  if (bVar2) {
                    pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                             ::operator[](local_1200,*(int *)((long)in_RDI + 0x2c));
                    *pVVar5 = ON_UPPER;
                  }
                  else {
                    local_1010 = in_RDI + 0x14;
                    local_1008 = local_1410;
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                              (in_stack_ffffffffffffcf90,
                               (cpp_dec_float<50U,_int,_void> *)
                               CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88));
                    local_1450 = 0;
                    local_11c0 = local_1448;
                    local_11c8 = &local_1450;
                    local_11d0 = 0;
                    local_c58 = local_11c8;
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                    cpp_dec_float<double>
                              (in_stack_ffffffffffffcfa0,(double)in_stack_ffffffffffffcf98,
                               in_stack_ffffffffffffcf90);
                    (**(code **)(*in_RDI + 0x38))(local_1488);
                    bVar2 = LErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                      (in_stack_ffffffffffffd050,in_stack_ffffffffffffd048,
                                       in_stack_ffffffffffffd040);
                    local_2e52 = false;
                    if (bVar2) {
                      local_1000 = in_RDI + 0x1b;
                      local_ff8 = local_14c0;
                      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                                (in_stack_ffffffffffffcf90,
                                 (cpp_dec_float<50U,_int,_void> *)
                                 CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88));
                      local_1500 = 0;
                      local_11a8 = local_14f8;
                      local_11b0 = &local_1500;
                      local_11b8 = 0;
                      local_c60 = local_11b0;
                      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                      cpp_dec_float<double>
                                (in_stack_ffffffffffffcfa0,(double)in_stack_ffffffffffffcf98,
                                 in_stack_ffffffffffffcf90);
                      (**(code **)(*in_RDI + 0x38))(local_1538);
                      local_2e52 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                             (in_stack_ffffffffffffd080,in_stack_ffffffffffffd078,
                                              in_stack_ffffffffffffd070);
                    }
                    if (local_2e52 == false) {
                      local_156d = 1;
                      uVar6 = __cxa_allocate_exception(0x28);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string
                                (local_1558,"XMAISM05 This should never happen.",&local_1559);
                      SPxInternalCodeException::SPxInternalCodeException
                                ((SPxInternalCodeException *)in_stack_ffffffffffffcf90,
                                 (string *)
                                 CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88));
                      local_156d = 0;
                      __cxa_throw(uVar6,&SPxInternalCodeException::typeinfo,
                                  SPxInternalCodeException::~SPxInternalCodeException);
                    }
                    pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                             ::operator[](local_1200,*(int *)((long)in_RDI + 0x2c));
                    *pVVar5 = ZERO;
                  }
                }
              }
              else {
                pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                         ::operator[](local_1200,*(int *)((long)in_RDI + 0x2c));
                *pVVar5 = FIXED;
              }
              local_1578 = 0;
              local_390 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        *)in_stack_ffffffffffffcf90,in_stack_ffffffffffffcf8c);
              local_398 = &local_1578;
              local_388 = local_398;
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        (in_stack_ffffffffffffd018,
                         (double)CONCAT44(in_stack_ffffffffffffd014,in_stack_ffffffffffffd010));
              local_ff0 = in_RDI + 6;
              local_fe8 = local_15b0;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                        (in_stack_ffffffffffffcf90,
                         (cpp_dec_float<50U,_int,_void> *)
                         CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88));
              (**(code **)(*in_RDI + 0x38))(local_15e8);
              bVar2 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                (in_stack_ffffffffffffd000,in_stack_ffffffffffffcff8);
              local_2e69 = false;
              if (bVar2) {
                local_fe0 = in_RDI + 0xd;
                local_fd8 = local_1620;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                          (in_stack_ffffffffffffcf90,
                           (cpp_dec_float<50U,_int,_void> *)
                           CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88));
                (**(code **)(*in_RDI + 0x38))(local_1658);
                bVar2 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                  (in_stack_ffffffffffffd000,in_stack_ffffffffffffcff8);
                local_2e69 = false;
                if (bVar2) {
                  local_2e69 = boost::multiprecision::operator==
                                         ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                           *)CONCAT44(in_stack_ffffffffffffcf8c,
                                                      in_stack_ffffffffffffcf88),
                                          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                           *)0x40cd4b);
                }
              }
              if (local_2e69 == false) {
                local_fd0 = in_RDI + 6;
                local_fc8 = local_1690;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                          (in_stack_ffffffffffffcf90,
                           (cpp_dec_float<50U,_int,_void> *)
                           CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88));
                (**(code **)(*in_RDI + 0x38))(local_16c8);
                bVar2 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                  (in_stack_ffffffffffffd000,in_stack_ffffffffffffcff8);
                if (bVar2) {
                  pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                           ::operator[](local_1200,(int)in_RDI[5]);
                  *pVVar5 = ON_LOWER;
                }
                else {
                  local_fc0 = in_RDI + 0xd;
                  local_fb8 = local_1700;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                            (in_stack_ffffffffffffcf90,
                             (cpp_dec_float<50U,_int,_void> *)
                             CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88));
                  (**(code **)(*in_RDI + 0x38))(local_1738);
                  bVar2 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                    (in_stack_ffffffffffffd000,in_stack_ffffffffffffcff8);
                  if (bVar2) {
                    pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                             ::operator[](local_1200,(int)in_RDI[5]);
                    *pVVar5 = ON_UPPER;
                  }
                  else {
                    local_fb0 = in_RDI + 6;
                    local_fa8 = local_1770;
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                              (in_stack_ffffffffffffcf90,
                               (cpp_dec_float<50U,_int,_void> *)
                               CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88));
                    local_17b0 = 0;
                    local_1190 = local_17a8;
                    local_1198 = &local_17b0;
                    local_11a0 = 0;
                    local_c68 = local_1198;
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                    cpp_dec_float<double>
                              (in_stack_ffffffffffffcfa0,(double)in_stack_ffffffffffffcf98,
                               in_stack_ffffffffffffcf90);
                    (**(code **)(*in_RDI + 0x38))(local_17e8);
                    bVar2 = LErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                      (in_stack_ffffffffffffd050,in_stack_ffffffffffffd048,
                                       in_stack_ffffffffffffd040);
                    local_2e6a = false;
                    if (bVar2) {
                      local_fa0 = in_RDI + 0xd;
                      local_f98 = local_1820;
                      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                                (in_stack_ffffffffffffcf90,
                                 (cpp_dec_float<50U,_int,_void> *)
                                 CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88));
                      local_1860 = 0;
                      local_1178 = local_1858;
                      local_1180 = &local_1860;
                      local_1188 = 0;
                      local_c70 = local_1180;
                      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                      cpp_dec_float<double>
                                (in_stack_ffffffffffffcfa0,(double)in_stack_ffffffffffffcf98,
                                 in_stack_ffffffffffffcf90);
                      (**(code **)(*in_RDI + 0x38))(local_1898);
                      local_2e6a = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                             (in_stack_ffffffffffffd080,in_stack_ffffffffffffd078,
                                              in_stack_ffffffffffffd070);
                    }
                    if (local_2e6a == false) {
                      local_18ba = 1;
                      uVar6 = __cxa_allocate_exception(0x28);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string
                                (local_18b8,"XMAISM06 This should never happen.",&local_18b9);
                      SPxInternalCodeException::SPxInternalCodeException
                                ((SPxInternalCodeException *)in_stack_ffffffffffffcf90,
                                 (string *)
                                 CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88));
                      local_18ba = 0;
                      __cxa_throw(uVar6,&SPxInternalCodeException::typeinfo,
                                  SPxInternalCodeException::~SPxInternalCodeException);
                    }
                    pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                             ::operator[](local_1200,(int)in_RDI[5]);
                    *pVVar5 = ZERO;
                  }
                }
              }
              else {
                pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                         ::operator[](local_1200,(int)in_RDI[5]);
                *pVVar5 = FIXED;
              }
            }
            else {
              pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                       ::operator[](local_1200,*(int *)((long)in_RDI + 0x2c));
              if (*pVVar5 == BASIC) {
                local_f90 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          *)in_stack_ffffffffffffcf90,in_stack_ffffffffffffcf8c);
                local_f88 = local_192c;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                          (in_stack_ffffffffffffcf90,
                           (cpp_dec_float<50U,_int,_void> *)
                           CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88));
                local_f80 = in_RDI + 0x14;
                local_f78 = local_1964;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                          (in_stack_ffffffffffffcf90,
                           (cpp_dec_float<50U,_int,_void> *)
                           CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88));
                maxAbs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT44(in_stack_ffffffffffffd08c,in_stack_ffffffffffffd088),
                           in_stack_ffffffffffffd080);
                local_f70 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          *)in_stack_ffffffffffffcf90,in_stack_ffffffffffffcf8c);
                local_f68 = local_19d4;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                          (in_stack_ffffffffffffcf90,
                           (cpp_dec_float<50U,_int,_void> *)
                           CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88));
                local_f60 = in_RDI + 0x1b;
                local_f58 = local_1a0c;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                          (in_stack_ffffffffffffcf90,
                           (cpp_dec_float<50U,_int,_void> *)
                           CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88));
                maxAbs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT44(in_stack_ffffffffffffd08c,in_stack_ffffffffffffd088),
                           in_stack_ffffffffffffd080);
                local_1a18 = 0x3ff0000000000000;
                tVar1 = boost::multiprecision::operator<
                                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88),
                                   (double *)0x40d304);
                if (tVar1) {
                  local_1a20 = 0x3ff0000000000000;
                  local_3a8 = &local_18f4;
                  local_3b0 = &local_1a20;
                  local_3a0 = local_3b0;
                  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                            (in_stack_ffffffffffffd018,
                             (double)CONCAT44(in_stack_ffffffffffffd014,in_stack_ffffffffffffd010));
                }
                local_1a28 = 0x3ff0000000000000;
                tVar1 = boost::multiprecision::operator<
                                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88),
                                   (double *)0x40d38a);
                if (tVar1) {
                  local_1a30 = 0x3ff0000000000000;
                  local_3c0 = &local_199c;
                  local_3c8 = &local_1a30;
                  local_3b8 = local_3c8;
                  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                            (in_stack_ffffffffffffd018,
                             (double)CONCAT44(in_stack_ffffffffffffd014,in_stack_ffffffffffffd010));
                }
                local_a80 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          *)in_stack_ffffffffffffcf90,in_stack_ffffffffffffcf8c);
                local_a78 = &local_1aa0;
                local_a88 = &local_18f4;
                boost::multiprecision::detail::
                scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                ::
                scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_a89,local_a80,local_a88);
                local_a70 = &local_1aa0;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                          (in_stack_ffffffffffffcf90);
                local_a58 = &local_1aa0;
                local_a60 = local_a80;
                local_a68 = local_a88;
                boost::multiprecision::default_ops::
                eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                          (in_stack_ffffffffffffcf90,
                           (cpp_dec_float<50U,_int,_void> *)
                           CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88),
                           (cpp_dec_float<50U,_int,_void> *)0x40d4b1);
                local_ac0 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)(in_RDI + 0x14);
                local_ab8 = &local_1ad8;
                local_ac8 = &local_18f4;
                boost::multiprecision::detail::
                scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                ::
                scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_ac9,local_ac0,local_ac8);
                local_ab0 = &local_1ad8;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                          (in_stack_ffffffffffffcf90);
                local_a98 = &local_1ad8;
                local_aa0 = local_ac0;
                local_aa8 = local_ac8;
                boost::multiprecision::default_ops::
                eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                          (in_stack_ffffffffffffcf90,
                           (cpp_dec_float<50U,_int,_void> *)
                           CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88),
                           (cpp_dec_float<50U,_int,_void> *)0x40d56e);
                local_328 = &local_1a68;
                local_330 = &local_1aa0;
                local_338 = &local_1ad8;
                boost::multiprecision::detail::
                scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                ::
                scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_339,local_330,local_338);
                local_320 = &local_1a68;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                          (in_stack_ffffffffffffcf90);
                local_308 = &local_1a68;
                local_310 = local_330;
                local_318 = local_338;
                boost::multiprecision::default_ops::
                eval_subtract<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                          (in_stack_ffffffffffffcf90,
                           (cpp_dec_float<50U,_int,_void> *)
                           CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88),
                           (cpp_dec_float<50U,_int,_void> *)0x40d625);
                local_b00 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          *)in_stack_ffffffffffffcf90,in_stack_ffffffffffffcf8c);
                local_af8 = &local_1b48;
                local_b08 = &local_199c;
                boost::multiprecision::detail::
                scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                ::
                scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_b09,local_b00,local_b08);
                local_af0 = &local_1b48;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                          (in_stack_ffffffffffffcf90);
                local_ad8 = &local_1b48;
                local_ae0 = local_b00;
                local_ae8 = local_b08;
                boost::multiprecision::default_ops::
                eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                          (in_stack_ffffffffffffcf90,
                           (cpp_dec_float<50U,_int,_void> *)
                           CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88),
                           (cpp_dec_float<50U,_int,_void> *)0x40d6ec);
                local_b40 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)(in_RDI + 0x1b);
                local_b38 = &local_1b80;
                local_b48 = &local_199c;
                boost::multiprecision::detail::
                scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                ::
                scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_b49,local_b40,local_b48);
                local_b30 = &local_1b80;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                          (in_stack_ffffffffffffcf90);
                local_b18 = &local_1b80;
                local_b20 = local_b40;
                local_b28 = local_b48;
                boost::multiprecision::default_ops::
                eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                          (in_stack_ffffffffffffcf90,
                           (cpp_dec_float<50U,_int,_void> *)
                           CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88),
                           (cpp_dec_float<50U,_int,_void> *)0x40d7a9);
                local_368 = &local_1b10;
                local_370 = &local_1b48;
                local_378 = &local_1b80;
                boost::multiprecision::detail::
                scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                ::
                scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_379,local_370,local_378);
                local_360 = &local_1b10;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                          (in_stack_ffffffffffffcf90);
                local_348 = &local_1b10;
                local_350 = local_370;
                local_358 = local_378;
                boost::multiprecision::default_ops::
                eval_subtract<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                          (in_stack_ffffffffffffcf90,
                           (cpp_dec_float<50U,_int,_void> *)
                           CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88),
                           (cpp_dec_float<50U,_int,_void> *)0x40d860);
                local_f48 = local_1bb8;
                local_f50 = &local_1a68;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                          (in_stack_ffffffffffffcf90,
                           (cpp_dec_float<50U,_int,_void> *)
                           CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88));
                (**(code **)(*in_RDI + 0x38))(local_1bf0);
                bVar2 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                  (in_stack_ffffffffffffd000,in_stack_ffffffffffffcff8);
                if (bVar2) {
                  local_1bf8 = 0;
                  local_3d8 = &local_1a68;
                  local_3e0 = &local_1bf8;
                  local_3d0 = local_3e0;
                  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                            (in_stack_ffffffffffffd018,
                             (double)CONCAT44(in_stack_ffffffffffffd014,in_stack_ffffffffffffd010));
                }
                local_f38 = local_1c30;
                local_f40 = &local_1b10;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                          (in_stack_ffffffffffffcf90,
                           (cpp_dec_float<50U,_int,_void> *)
                           CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88));
                (**(code **)(*in_RDI + 0x38))(local_1c68);
                bVar2 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                  (in_stack_ffffffffffffd000,in_stack_ffffffffffffcff8);
                if (bVar2) {
                  local_1c70 = 0;
                  local_3f0 = &local_1b10;
                  local_3f8 = &local_1c70;
                  local_3e8 = local_3f8;
                  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                            (in_stack_ffffffffffffd018,
                             (double)CONCAT44(in_stack_ffffffffffffd014,in_stack_ffffffffffffd010));
                }
                puVar7 = (ulong *)infinity();
                local_1cb0 = *puVar7 ^ 0x8000000000000000;
                local_1160 = local_1ca8;
                local_1168 = &local_1cb0;
                local_1170 = 0;
                local_c78 = local_1168;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                cpp_dec_float<double>
                          (in_stack_ffffffffffffcfa0,(double)in_stack_ffffffffffffcf98,
                           in_stack_ffffffffffffcf90);
                tVar1 = boost::multiprecision::operator<=
                                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88),
                                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)0x40da81);
                local_2e81 = false;
                if (tVar1) {
                  local_1150 = infinity();
                  local_1148 = local_1ce8;
                  local_1158 = 0;
                  local_c80 = local_1150;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                  cpp_dec_float<double>
                            (in_stack_ffffffffffffcfa0,(double)in_stack_ffffffffffffcf98,
                             in_stack_ffffffffffffcf90);
                  tVar1 = boost::multiprecision::operator>=
                                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88
                                                ),
                                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)0x40db15);
                  local_2e81 = false;
                  if (tVar1) {
                    puVar7 = (ulong *)infinity();
                    local_1d28 = *puVar7 ^ 0x8000000000000000;
                    local_1130 = local_1d20;
                    local_1138 = &local_1d28;
                    local_1140 = 0;
                    local_c88 = local_1138;
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                    cpp_dec_float<double>
                              (in_stack_ffffffffffffcfa0,(double)in_stack_ffffffffffffcf98,
                               in_stack_ffffffffffffcf90);
                    tVar1 = boost::multiprecision::operator<=
                                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)CONCAT44(in_stack_ffffffffffffcf8c,
                                                   in_stack_ffffffffffffcf88),
                                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)0x40dbd7);
                    local_2e81 = false;
                    if (tVar1) {
                      local_1120 = infinity();
                      local_1118 = local_1d60;
                      local_1128 = 0;
                      local_c90 = local_1120;
                      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                      cpp_dec_float<double>
                                (in_stack_ffffffffffffcfa0,(double)in_stack_ffffffffffffcf98,
                                 in_stack_ffffffffffffcf90);
                      local_2e81 = boost::multiprecision::operator>=
                                             ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                               *)CONCAT44(in_stack_ffffffffffffcf8c,
                                                          in_stack_ffffffffffffcf88),
                                              (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                               *)0x40dc6d);
                    }
                  }
                }
                if (local_2e81 == false) {
                  local_1d70 = 0;
                  tVar1 = boost::multiprecision::operator>
                                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88
                                                ),(double *)0x40dd37);
                  if (tVar1) {
                    local_f30 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                              *)in_stack_ffffffffffffcf90,in_stack_ffffffffffffcf8c)
                    ;
                    local_f28 = local_1da8;
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                              (in_stack_ffffffffffffcf90,
                               (cpp_dec_float<50U,_int,_void> *)
                               CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88));
                    local_440 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)(in_RDI + 0x22);
                    local_448 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)(in_RDI + 0xd);
                    local_438 = &local_1e18;
                    boost::multiprecision::detail::
                    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                    ::
                    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              (&local_449,local_440,local_448);
                    local_430 = &local_1e18;
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                              (in_stack_ffffffffffffcf90);
                    local_418 = &local_1e18;
                    local_420 = local_440;
                    local_428 = local_448;
                    boost::multiprecision::default_ops::
                    eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                              (in_stack_ffffffffffffcf90,
                               (cpp_dec_float<50U,_int,_void> *)
                               CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88),
                               (cpp_dec_float<50U,_int,_void> *)0x40de54);
                    local_28 = local_1de0;
                    local_38 = &local_1e18;
                    local_30 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)(in_RDI + 0x1b);
                    boost::multiprecision::detail::
                    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                    ::
                    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              (&local_39,
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)(in_RDI + 0x1b),local_38);
                    local_20 = local_1de0;
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                              (in_stack_ffffffffffffcf90);
                    local_8 = local_1de0;
                    local_10 = local_30;
                    local_18 = local_38;
                    boost::multiprecision::default_ops::
                    eval_add<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                              (in_stack_ffffffffffffcf90,
                               (cpp_dec_float<50U,_int,_void> *)
                               CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88),
                               (cpp_dec_float<50U,_int,_void> *)0x40df0b);
                    (**(code **)(*in_RDI + 0x38))(local_1e50);
                    bVar2 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                      (in_stack_ffffffffffffd080,in_stack_ffffffffffffd078,
                                       in_stack_ffffffffffffd070);
                    if (bVar2) {
                      bVar2 = boost::multiprecision::operator==
                                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)CONCAT44(in_stack_ffffffffffffcf8c,
                                                     in_stack_ffffffffffffcf88),
                                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)0x40df5f);
                      VVar8 = ON_UPPER;
                      if (bVar2) {
                        VVar8 = FIXED;
                      }
                      pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                               ::operator[](local_1200,(int)in_RDI[5]);
                      *pVVar5 = VVar8;
                      local_d68 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                *)in_stack_ffffffffffffcf90,
                                               in_stack_ffffffffffffcf8c);
                      local_d70 = in_RDI + 0xd;
                      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                                (in_stack_ffffffffffffcf90,
                                 (cpp_dec_float<50U,_int,_void> *)
                                 CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88));
                      local_488 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                *)in_stack_ffffffffffffcf90,
                                               in_stack_ffffffffffffcf8c);
                      local_478 = local_1e88;
                      local_480 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)(in_RDI + 0x22);
                      boost::multiprecision::detail::
                      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                      ::
                      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                (&local_489,
                                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)(in_RDI + 0x22),local_488);
                      local_470 = local_1e88;
                      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                                (in_stack_ffffffffffffcf90);
                      local_458 = local_1e88;
                      local_460 = local_480;
                      local_468 = local_488;
                      boost::multiprecision::default_ops::
                      eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                (in_stack_ffffffffffffcf90,
                                 (cpp_dec_float<50U,_int,_void> *)
                                 CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88),
                                 (cpp_dec_float<50U,_int,_void> *)0x40e0cb);
                      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)in_stack_ffffffffffffcf90,in_stack_ffffffffffffcf8c);
                      boost::multiprecision::
                      number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      ::operator-=(in_stack_ffffffffffffcfb0,
                                   (self_type *)
                                   CONCAT44(in_stack_ffffffffffffcfac,in_stack_ffffffffffffcfa8));
                    }
                    else {
                      local_f20 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                *)in_stack_ffffffffffffcf90,
                                               in_stack_ffffffffffffcf8c);
                      local_f18 = local_1ec0;
                      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                                (in_stack_ffffffffffffcf90,
                                 (cpp_dec_float<50U,_int,_void> *)
                                 CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88));
                      local_4c0 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)(in_RDI + 0x22);
                      local_4c8 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)(in_RDI + 0xd);
                      local_4b8 = &local_1f30;
                      boost::multiprecision::detail::
                      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                      ::
                      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                (&local_4c9,local_4c0,local_4c8);
                      local_4b0 = &local_1f30;
                      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                                (in_stack_ffffffffffffcf90);
                      local_498 = &local_1f30;
                      local_4a0 = local_4c0;
                      local_4a8 = local_4c8;
                      boost::multiprecision::default_ops::
                      eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                (in_stack_ffffffffffffcf90,
                                 (cpp_dec_float<50U,_int,_void> *)
                                 CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88),
                                 (cpp_dec_float<50U,_int,_void> *)0x40e20c);
                      local_68 = local_1ef8;
                      local_78 = &local_1f30;
                      local_70 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)(in_RDI + 0x14);
                      boost::multiprecision::detail::
                      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                      ::
                      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                (&local_79,
                                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)(in_RDI + 0x14),local_78);
                      local_60 = local_1ef8;
                      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                                (in_stack_ffffffffffffcf90);
                      local_48 = local_1ef8;
                      local_50 = local_70;
                      local_58 = local_78;
                      boost::multiprecision::default_ops::
                      eval_add<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                (in_stack_ffffffffffffcf90,
                                 (cpp_dec_float<50U,_int,_void> *)
                                 CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88),
                                 (cpp_dec_float<50U,_int,_void> *)0x40e2c3);
                      (**(code **)(*in_RDI + 0x38))(local_1f68);
                      bVar2 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                        (in_stack_ffffffffffffd080,in_stack_ffffffffffffd078,
                                         in_stack_ffffffffffffd070);
                      local_2ec5 = false;
                      if (bVar2) {
                        local_1108 = infinity();
                        local_1100 = local_1fa0;
                        local_1110 = 0;
                        local_c98 = local_1108;
                        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                        cpp_dec_float<double>
                                  (in_stack_ffffffffffffcfa0,(double)in_stack_ffffffffffffcf98,
                                   in_stack_ffffffffffffcf90);
                        local_2ec5 = boost::multiprecision::operator<
                                               ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                 *)CONCAT44(in_stack_ffffffffffffcf8c,
                                                            in_stack_ffffffffffffcf88),
                                                (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                 *)0x40e38a);
                      }
                      if (local_2ec5 == false) {
                        local_f10 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  *)in_stack_ffffffffffffcf90,
                                                 in_stack_ffffffffffffcf8c);
                        local_f08 = local_2010;
                        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                        cpp_dec_float(in_stack_ffffffffffffcf90,
                                      (cpp_dec_float<50U,_int,_void> *)
                                      CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88))
                        ;
                        local_540 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)(in_RDI + 0x22);
                        local_548 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)(in_RDI + 6);
                        local_538 = &local_2080;
                        boost::multiprecision::detail::
                        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                        ::
                        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                  (&local_549,local_540,local_548);
                        local_530 = &local_2080;
                        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                        cpp_dec_float(in_stack_ffffffffffffcf90);
                        local_518 = &local_2080;
                        local_520 = local_540;
                        local_528 = local_548;
                        boost::multiprecision::default_ops::
                        eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                  (in_stack_ffffffffffffcf90,
                                   (cpp_dec_float<50U,_int,_void> *)
                                   CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88),
                                   (cpp_dec_float<50U,_int,_void> *)0x40e666);
                        local_a8 = local_2048;
                        local_b8 = &local_2080;
                        local_b0 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)(in_RDI + 0x1b);
                        boost::multiprecision::detail::
                        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                        ::
                        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                  (&local_b9,
                                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)(in_RDI + 0x1b),local_b8);
                        local_a0 = local_2048;
                        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                        cpp_dec_float(in_stack_ffffffffffffcf90);
                        local_88 = local_2048;
                        local_90 = local_b0;
                        local_98 = local_b8;
                        boost::multiprecision::default_ops::
                        eval_add<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                  (in_stack_ffffffffffffcf90,
                                   (cpp_dec_float<50U,_int,_void> *)
                                   CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88),
                                   (cpp_dec_float<50U,_int,_void> *)0x40e71d);
                        (**(code **)(*in_RDI + 0x38))(local_20b8);
                        bVar2 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                          (in_stack_ffffffffffffd080,in_stack_ffffffffffffd078,
                                           in_stack_ffffffffffffd070);
                        local_2eed = false;
                        if (bVar2) {
                          local_10f0 = infinity();
                          local_10e8 = local_20f0;
                          local_10f8 = 0;
                          local_ca0 = local_10f0;
                          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                          cpp_dec_float<double>
                                    (in_stack_ffffffffffffcfa0,(double)in_stack_ffffffffffffcf98,
                                     in_stack_ffffffffffffcf90);
                          local_2eed = boost::multiprecision::operator<
                                                 ((
                                                  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)CONCAT44(in_stack_ffffffffffffcf8c,
                                                             in_stack_ffffffffffffcf88),
                                                  (
                                                  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)0x40e7e6);
                        }
                        if (local_2eed == false) {
                          local_f00 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ::operator[]((
                                                  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  *)in_stack_ffffffffffffcf90,
                                                  in_stack_ffffffffffffcf8c);
                          local_ef8 = local_2198;
                          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                          cpp_dec_float(in_stack_ffffffffffffcf90,
                                        (cpp_dec_float<50U,_int,_void> *)
                                        CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88
                                                ));
                          local_5c0 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                       *)(in_RDI + 0x22);
                          local_5c8 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                       *)(in_RDI + 6);
                          local_5b8 = &local_2208;
                          boost::multiprecision::detail::
                          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                          ::
                          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                    (&local_5c9,local_5c0,local_5c8);
                          local_5b0 = &local_2208;
                          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                          cpp_dec_float(in_stack_ffffffffffffcf90);
                          local_598 = &local_2208;
                          local_5a0 = local_5c0;
                          local_5a8 = local_5c8;
                          boost::multiprecision::default_ops::
                          eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                    (in_stack_ffffffffffffcf90,
                                     (cpp_dec_float<50U,_int,_void> *)
                                     CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88),
                                     (cpp_dec_float<50U,_int,_void> *)0x40eba1);
                          local_e8 = local_21d0;
                          local_f8 = &local_2208;
                          local_f0 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)(in_RDI + 0x14);
                          boost::multiprecision::detail::
                          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                          ::
                          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                    (&local_f9,
                                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)(in_RDI + 0x14),local_f8);
                          local_e0 = local_21d0;
                          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                          cpp_dec_float(in_stack_ffffffffffffcf90);
                          local_c8 = local_21d0;
                          local_d0 = local_f0;
                          local_d8 = local_f8;
                          boost::multiprecision::default_ops::
                          eval_add<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                    (in_stack_ffffffffffffcf90,
                                     (cpp_dec_float<50U,_int,_void> *)
                                     CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88),
                                     (cpp_dec_float<50U,_int,_void> *)0x40ec58);
                          (**(code **)(*in_RDI + 0x38))(local_2240);
                          bVar2 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                            (in_stack_ffffffffffffd080,in_stack_ffffffffffffd078,
                                             in_stack_ffffffffffffd070);
                          local_2f0d = false;
                          if (bVar2) {
                            puVar7 = (ulong *)infinity();
                            local_2280 = *puVar7 ^ 0x8000000000000000;
                            local_10d0 = local_2278;
                            local_10d8 = &local_2280;
                            local_10e0 = 0;
                            local_ca8 = local_10d8;
                            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                            cpp_dec_float<double>
                                      (in_stack_ffffffffffffcfa0,(double)in_stack_ffffffffffffcf98,
                                       in_stack_ffffffffffffcf90);
                            local_2f0d = boost::multiprecision::operator>
                                                   ((
                                                  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)CONCAT44(in_stack_ffffffffffffcf8c,
                                                             in_stack_ffffffffffffcf88),
                                                  (
                                                  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)0x40ed4b);
                          }
                          if (local_2f0d == false) {
                            local_ef0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        ::operator[]((
                                                  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  *)in_stack_ffffffffffffcf90,
                                                  in_stack_ffffffffffffcf8c);
                            local_ee8 = local_22f0;
                            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                            cpp_dec_float(in_stack_ffffffffffffcf90,
                                          (cpp_dec_float<50U,_int,_void> *)
                                          CONCAT44(in_stack_ffffffffffffcf8c,
                                                   in_stack_ffffffffffffcf88));
                            local_640 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                         *)(in_RDI + 0x22);
                            local_648 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                         *)(in_RDI + 6);
                            local_638 = &local_2360;
                            boost::multiprecision::detail::
                            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                            ::
                            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                      (&local_649,local_640,local_648);
                            local_630 = &local_2360;
                            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                            cpp_dec_float(in_stack_ffffffffffffcf90);
                            local_618 = &local_2360;
                            local_620 = local_640;
                            local_628 = local_648;
                            boost::multiprecision::default_ops::
                            eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                      (in_stack_ffffffffffffcf90,
                                       (cpp_dec_float<50U,_int,_void> *)
                                       CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88)
                                       ,(cpp_dec_float<50U,_int,_void> *)0x40f02a);
                            local_128 = local_2328;
                            local_138 = &local_2360;
                            local_130 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                         *)(in_RDI + 0x14);
                            boost::multiprecision::detail::
                            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                            ::
                            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                      (&local_139,
                                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)(in_RDI + 0x14),local_138);
                            local_120 = local_2328;
                            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                            cpp_dec_float(in_stack_ffffffffffffcf90);
                            local_108 = local_2328;
                            local_110 = local_130;
                            local_118 = local_138;
                            boost::multiprecision::default_ops::
                            eval_add<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                      (in_stack_ffffffffffffcf90,
                                       (cpp_dec_float<50U,_int,_void> *)
                                       CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88)
                                       ,(cpp_dec_float<50U,_int,_void> *)0x40f0e1);
                            (**(code **)(*in_RDI + 0x38))(local_2398);
                            bVar2 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                              (in_stack_ffffffffffffd080,in_stack_ffffffffffffd078,
                                               in_stack_ffffffffffffd070);
                            local_2f35 = false;
                            if (bVar2) {
                              puVar7 = (ulong *)infinity();
                              local_23d8 = *puVar7 ^ 0x8000000000000000;
                              local_10b8 = local_23d0;
                              local_10c0 = &local_23d8;
                              local_10c8 = 0;
                              local_cb0 = local_10c0;
                              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                              cpp_dec_float<double>
                                        (in_stack_ffffffffffffcfa0,(double)in_stack_ffffffffffffcf98
                                         ,in_stack_ffffffffffffcf90);
                              local_2f35 = boost::multiprecision::operator>
                                                     ((
                                                  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)CONCAT44(in_stack_ffffffffffffcf8c,
                                                             in_stack_ffffffffffffcf88),
                                                  (
                                                  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)0x40f1d6);
                            }
                            if (local_2f35 == false) {
                              local_ee0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          ::operator[]((
                                                  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  *)in_stack_ffffffffffffcf90,
                                                  in_stack_ffffffffffffcf8c);
                              local_ed8 = local_2480;
                              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                              cpp_dec_float(in_stack_ffffffffffffcf90,
                                            (cpp_dec_float<50U,_int,_void> *)
                                            CONCAT44(in_stack_ffffffffffffcf8c,
                                                     in_stack_ffffffffffffcf88));
                              local_6c0 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                           *)(in_RDI + 0x22);
                              local_6c8 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                           *)(in_RDI + 6);
                              local_6b8 = &local_24f0;
                              boost::multiprecision::detail::
                              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                              ::
                              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                        (&local_6c9,local_6c0,local_6c8);
                              local_6b0 = &local_24f0;
                              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                              cpp_dec_float(in_stack_ffffffffffffcf90);
                              local_698 = &local_24f0;
                              local_6a0 = local_6c0;
                              local_6a8 = local_6c8;
                              boost::multiprecision::default_ops::
                              eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                        (in_stack_ffffffffffffcf90,
                                         (cpp_dec_float<50U,_int,_void> *)
                                         CONCAT44(in_stack_ffffffffffffcf8c,
                                                  in_stack_ffffffffffffcf88),
                                         (cpp_dec_float<50U,_int,_void> *)0x40f594);
                              local_168 = local_24b8;
                              local_178 = &local_24f0;
                              local_170 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                           *)(in_RDI + 0x14);
                              boost::multiprecision::detail::
                              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                              ::
                              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                        (&local_179,
                                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)(in_RDI + 0x14),local_178);
                              local_160 = local_24b8;
                              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                              cpp_dec_float(in_stack_ffffffffffffcf90);
                              local_148 = local_24b8;
                              local_150 = local_170;
                              local_158 = local_178;
                              boost::multiprecision::default_ops::
                              eval_add<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                        (in_stack_ffffffffffffcf90,
                                         (cpp_dec_float<50U,_int,_void> *)
                                         CONCAT44(in_stack_ffffffffffffcf8c,
                                                  in_stack_ffffffffffffcf88),
                                         (cpp_dec_float<50U,_int,_void> *)0x40f64b);
                              (**(code **)(*in_RDI + 0x38))(local_2528);
                              bVar2 = LTrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                                (in_stack_ffffffffffffd080,in_stack_ffffffffffffd078
                                                 ,in_stack_ffffffffffffd070);
                              if (!bVar2) {
                                local_2582 = 1;
                                uVar6 = __cxa_allocate_exception(0x28);
                                paVar9 = &local_2581;
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string
                                          (local_2580,"XMAISM08 This should never happen.",paVar9);
                                SPxInternalCodeException::SPxInternalCodeException
                                          ((SPxInternalCodeException *)in_stack_ffffffffffffcf90,
                                           (string *)
                                           CONCAT44(in_stack_ffffffffffffcf8c,
                                                    in_stack_ffffffffffffcf88));
                                local_2582 = 0;
                                __cxa_throw(uVar6,&SPxInternalCodeException::typeinfo,
                                            SPxInternalCodeException::~SPxInternalCodeException);
                              }
                              bVar2 = boost::multiprecision::operator==
                                                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)CONCAT44(in_stack_ffffffffffffcf8c,
                                                             in_stack_ffffffffffffcf88),
                                                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)0x40f69f);
                              VVar8 = ON_LOWER;
                              if (bVar2) {
                                VVar8 = FIXED;
                              }
                              pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                                       ::operator[](local_1200,(int)in_RDI[5]);
                              *pVVar5 = VVar8;
                              local_db8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          ::operator[]((
                                                  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  *)in_stack_ffffffffffffcf90,
                                                  in_stack_ffffffffffffcf8c);
                              local_dc0 = in_RDI + 6;
                              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                              operator=(in_stack_ffffffffffffcf90,
                                        (cpp_dec_float<50U,_int,_void> *)
                                        CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88
                                                ));
                              local_708 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          ::operator[]((
                                                  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  *)in_stack_ffffffffffffcf90,
                                                  in_stack_ffffffffffffcf8c);
                              local_6f8 = local_2560;
                              local_700 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                           *)(in_RDI + 0x22);
                              boost::multiprecision::detail::
                              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                              ::
                              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                        (&local_709,
                                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)(in_RDI + 0x22),local_708);
                              local_6f0 = local_2560;
                              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                              cpp_dec_float(in_stack_ffffffffffffcf90);
                              local_6d8 = local_2560;
                              local_6e0 = local_700;
                              local_6e8 = local_708;
                              boost::multiprecision::default_ops::
                              eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                        (in_stack_ffffffffffffcf90,
                                         (cpp_dec_float<50U,_int,_void> *)
                                         CONCAT44(in_stack_ffffffffffffcf8c,
                                                  in_stack_ffffffffffffcf88),
                                         (cpp_dec_float<50U,_int,_void> *)0x40f80e);
                              VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                            *)in_stack_ffffffffffffcf90,in_stack_ffffffffffffcf8c);
                              boost::multiprecision::
                              number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              ::operator-=(in_stack_ffffffffffffcfb0,
                                           (self_type *)
                                           CONCAT44(in_stack_ffffffffffffcfac,
                                                    in_stack_ffffffffffffcfa8));
                            }
                            else {
                              bVar2 = boost::multiprecision::operator==
                                                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)CONCAT44(in_stack_ffffffffffffcf8c,
                                                             in_stack_ffffffffffffcf88),
                                                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)0x40f20b);
                              VVar8 = ON_LOWER;
                              if (bVar2) {
                                VVar8 = FIXED;
                              }
                              pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                                       ::operator[](local_1200,*(int *)((long)in_RDI + 0x2c));
                              *pVVar5 = VVar8;
                              local_da8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          ::operator[]((
                                                  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  *)in_stack_ffffffffffffcf90,
                                                  in_stack_ffffffffffffcf8c);
                              local_db0 = in_RDI + 0x14;
                              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                              operator=(in_stack_ffffffffffffcf90,
                                        (cpp_dec_float<50U,_int,_void> *)
                                        CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88
                                                ));
                              pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                                       ::operator[](local_1200,(int)in_RDI[5]);
                              *pVVar5 = BASIC;
                              local_678 = &local_2448;
                              local_680 = &local_1a68;
                              local_688 = &local_18f4;
                              boost::multiprecision::detail::
                              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                              ::
                              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                        (&local_689,local_680,local_688);
                              local_670 = &local_2448;
                              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                              cpp_dec_float(in_stack_ffffffffffffcf90);
                              local_658 = &local_2448;
                              local_660 = local_680;
                              local_668 = local_688;
                              boost::multiprecision::default_ops::
                              eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                        (in_stack_ffffffffffffcf90,
                                         (cpp_dec_float<50U,_int,_void> *)
                                         CONCAT44(in_stack_ffffffffffffcf8c,
                                                  in_stack_ffffffffffffcf88),
                                         (cpp_dec_float<50U,_int,_void> *)0x40f379);
                              local_bc8 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                           *)(in_RDI + 0x22);
                              local_bb8 = local_2410;
                              local_bc0 = &local_2448;
                              boost::multiprecision::detail::
                              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                              ::
                              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                        (&local_bc9,local_bc0,local_bc8);
                              local_bb0 = local_2410;
                              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                              cpp_dec_float(in_stack_ffffffffffffcf90);
                              local_b98 = local_2410;
                              local_ba0 = local_bc0;
                              local_ba8 = local_bc8;
                              boost::multiprecision::default_ops::
                              eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                        (in_stack_ffffffffffffcf90,
                                         (cpp_dec_float<50U,_int,_void> *)
                                         CONCAT44(in_stack_ffffffffffffcf8c,
                                                  in_stack_ffffffffffffcf88),
                                         (cpp_dec_float<50U,_int,_void> *)0x40f436);
                              local_e38 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          ::operator[]((
                                                  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  *)in_stack_ffffffffffffcf90,
                                                  in_stack_ffffffffffffcf8c);
                              local_e40 = local_2410;
                              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                              operator=(in_stack_ffffffffffffcf90,
                                        (cpp_dec_float<50U,_int,_void> *)
                                        CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88
                                                ));
                            }
                          }
                          else {
                            bVar2 = boost::multiprecision::operator==
                                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                *)CONCAT44(in_stack_ffffffffffffcf8c,
                                                           in_stack_ffffffffffffcf88),
                                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                *)0x40ed7a);
                            VVar8 = ON_LOWER;
                            if (bVar2) {
                              VVar8 = FIXED;
                            }
                            pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                                     ::operator[](local_1200,(int)in_RDI[5]);
                            *pVVar5 = VVar8;
                            local_d98 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        ::operator[]((
                                                  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  *)in_stack_ffffffffffffcf90,
                                                  in_stack_ffffffffffffcf8c);
                            local_da0 = in_RDI + 6;
                            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                            operator=(in_stack_ffffffffffffcf90,
                                      (cpp_dec_float<50U,_int,_void> *)
                                      CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88))
                            ;
                            local_608 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        ::operator[]((
                                                  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  *)in_stack_ffffffffffffcf90,
                                                  in_stack_ffffffffffffcf8c);
                            local_5f8 = local_22b8;
                            local_600 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                         *)(in_RDI + 0x22);
                            boost::multiprecision::detail::
                            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                            ::
                            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                      (&local_609,
                                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)(in_RDI + 0x22),local_608);
                            local_5f0 = local_22b8;
                            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                            cpp_dec_float(in_stack_ffffffffffffcf90);
                            local_5d8 = local_22b8;
                            local_5e0 = local_600;
                            local_5e8 = local_608;
                            boost::multiprecision::default_ops::
                            eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                      (in_stack_ffffffffffffcf90,
                                       (cpp_dec_float<50U,_int,_void> *)
                                       CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88)
                                       ,(cpp_dec_float<50U,_int,_void> *)0x40eee9);
                            VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          *)in_stack_ffffffffffffcf90,in_stack_ffffffffffffcf8c);
                            boost::multiprecision::
                            number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            ::operator-=(in_stack_ffffffffffffcfb0,
                                         (self_type *)
                                         CONCAT44(in_stack_ffffffffffffcfac,
                                                  in_stack_ffffffffffffcfa8));
                          }
                        }
                        else {
                          bVar2 = boost::multiprecision::operator==
                                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                              *)CONCAT44(in_stack_ffffffffffffcf8c,
                                                         in_stack_ffffffffffffcf88),
                                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                              *)0x40e81b);
                          VVar8 = ON_UPPER;
                          if (bVar2) {
                            VVar8 = FIXED;
                          }
                          pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                                   ::operator[](local_1200,*(int *)((long)in_RDI + 0x2c));
                          *pVVar5 = VVar8;
                          local_d88 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ::operator[]((
                                                  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  *)in_stack_ffffffffffffcf90,
                                                  in_stack_ffffffffffffcf8c);
                          local_d90 = in_RDI + 0x1b;
                          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                                    (in_stack_ffffffffffffcf90,
                                     (cpp_dec_float<50U,_int,_void> *)
                                     CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88));
                          pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                                   ::operator[](local_1200,(int)in_RDI[5]);
                          *pVVar5 = BASIC;
                          local_578 = &local_2160;
                          local_580 = &local_1b10;
                          local_588 = &local_199c;
                          boost::multiprecision::detail::
                          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                          ::
                          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                    (&local_589,local_580,local_588);
                          local_570 = &local_2160;
                          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                          cpp_dec_float(in_stack_ffffffffffffcf90);
                          local_558 = &local_2160;
                          local_560 = local_580;
                          local_568 = local_588;
                          boost::multiprecision::default_ops::
                          eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                    (in_stack_ffffffffffffcf90,
                                     (cpp_dec_float<50U,_int,_void> *)
                                     CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88),
                                     (cpp_dec_float<50U,_int,_void> *)0x40e986);
                          local_b88 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                       *)(in_RDI + 0x22);
                          local_b78 = local_2128;
                          local_b80 = &local_2160;
                          boost::multiprecision::detail::
                          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                          ::
                          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                    (&local_b89,local_b80,local_b88);
                          local_b70 = local_2128;
                          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                          cpp_dec_float(in_stack_ffffffffffffcf90);
                          local_b58 = local_2128;
                          local_b60 = local_b80;
                          local_b68 = local_b88;
                          boost::multiprecision::default_ops::
                          eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                    (in_stack_ffffffffffffcf90,
                                     (cpp_dec_float<50U,_int,_void> *)
                                     CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88),
                                     (cpp_dec_float<50U,_int,_void> *)0x40ea43);
                          local_e28 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ::operator[]((
                                                  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  *)in_stack_ffffffffffffcf90,
                                                  in_stack_ffffffffffffcf8c);
                          local_e30 = local_2128;
                          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                                    (in_stack_ffffffffffffcf90,
                                     (cpp_dec_float<50U,_int,_void> *)
                                     CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88));
                        }
                      }
                      else {
                        bVar2 = boost::multiprecision::operator==
                                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                            *)CONCAT44(in_stack_ffffffffffffcf8c,
                                                       in_stack_ffffffffffffcf88),
                                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                            *)0x40e3b9);
                        VVar8 = ON_UPPER;
                        if (bVar2) {
                          VVar8 = FIXED;
                        }
                        pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                                 ::operator[](local_1200,(int)in_RDI[5]);
                        *pVVar5 = VVar8;
                        local_d78 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  *)in_stack_ffffffffffffcf90,
                                                 in_stack_ffffffffffffcf8c);
                        local_d80 = in_RDI + 0xd;
                        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                                  (in_stack_ffffffffffffcf90,
                                   (cpp_dec_float<50U,_int,_void> *)
                                   CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88));
                        local_508 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  *)in_stack_ffffffffffffcf90,
                                                 in_stack_ffffffffffffcf8c);
                        local_4f8 = local_1fd8;
                        local_500 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)(in_RDI + 0x22);
                        boost::multiprecision::detail::
                        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                        ::
                        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                  (&local_509,
                                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)(in_RDI + 0x22),local_508);
                        local_4f0 = local_1fd8;
                        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                        cpp_dec_float(in_stack_ffffffffffffcf90);
                        local_4d8 = local_1fd8;
                        local_4e0 = local_500;
                        local_4e8 = local_508;
                        boost::multiprecision::default_ops::
                        eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                  (in_stack_ffffffffffffcf90,
                                   (cpp_dec_float<50U,_int,_void> *)
                                   CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88),
                                   (cpp_dec_float<50U,_int,_void> *)0x40e525);
                        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)in_stack_ffffffffffffcf90,in_stack_ffffffffffffcf8c);
                        boost::multiprecision::
                        number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        ::operator-=(in_stack_ffffffffffffcfb0,
                                     (self_type *)
                                     CONCAT44(in_stack_ffffffffffffcfac,in_stack_ffffffffffffcfa8));
                      }
                    }
                  }
                  else {
                    local_ed0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                              *)in_stack_ffffffffffffcf90,in_stack_ffffffffffffcf8c)
                    ;
                    local_ec8 = local_25bc;
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                              (in_stack_ffffffffffffcf90,
                               (cpp_dec_float<50U,_int,_void> *)
                               CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88));
                    pnVar4 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)(in_RDI + 0x1b);
                    local_740 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)(in_RDI + 0x22);
                    local_748 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)(in_RDI + 6);
                    local_738 = &local_262c;
                    boost::multiprecision::detail::
                    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                    ::
                    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              (&local_749,local_740,local_748);
                    local_730 = &local_262c;
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                              (in_stack_ffffffffffffcf90);
                    local_718 = &local_262c;
                    local_720 = local_740;
                    local_728 = local_748;
                    boost::multiprecision::default_ops::
                    eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                              (in_stack_ffffffffffffcf90,
                               (cpp_dec_float<50U,_int,_void> *)
                               CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88),
                               (cpp_dec_float<50U,_int,_void> *)0x40fa4c);
                    local_1a8 = local_25f4;
                    local_1b8 = &local_262c;
                    local_1b0 = pnVar4;
                    boost::multiprecision::detail::
                    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                    ::
                    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              (&local_1b9,pnVar4,local_1b8);
                    local_1a0 = local_25f4;
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                              (in_stack_ffffffffffffcf90);
                    local_188 = local_25f4;
                    local_190 = local_1b0;
                    local_198 = local_1b8;
                    boost::multiprecision::default_ops::
                    eval_add<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                              (in_stack_ffffffffffffcf90,
                               (cpp_dec_float<50U,_int,_void> *)
                               CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88),
                               (cpp_dec_float<50U,_int,_void> *)0x40fb03);
                    (**(code **)(*in_RDI + 0x38))(local_2664);
                    bVar2 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                      (in_stack_ffffffffffffd080,in_stack_ffffffffffffd078,pnVar4);
                    if (bVar2) {
                      bVar2 = boost::multiprecision::operator==
                                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)CONCAT44(in_stack_ffffffffffffcf8c,
                                                     in_stack_ffffffffffffcf88),
                                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)0x40fb57);
                      VVar8 = ON_LOWER;
                      if (bVar2) {
                        VVar8 = FIXED;
                      }
                      pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                               ::operator[](local_1200,(int)in_RDI[5]);
                      *pVVar5 = VVar8;
                      local_dc8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                *)in_stack_ffffffffffffcf90,
                                               in_stack_ffffffffffffcf8c);
                      local_dd0 = in_RDI + 6;
                      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                                (in_stack_ffffffffffffcf90,
                                 (cpp_dec_float<50U,_int,_void> *)
                                 CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88));
                      local_788 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                *)in_stack_ffffffffffffcf90,
                                               in_stack_ffffffffffffcf8c);
                      local_778 = local_269c;
                      local_780 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)(in_RDI + 0x22);
                      boost::multiprecision::detail::
                      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                      ::
                      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                (&local_789,
                                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)(in_RDI + 0x22),local_788);
                      local_770 = local_269c;
                      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                                (in_stack_ffffffffffffcf90);
                      local_758 = local_269c;
                      local_760 = local_780;
                      local_768 = local_788;
                      boost::multiprecision::default_ops::
                      eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                (in_stack_ffffffffffffcf90,
                                 (cpp_dec_float<50U,_int,_void> *)
                                 CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88),
                                 (cpp_dec_float<50U,_int,_void> *)0x40fcc6);
                      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)in_stack_ffffffffffffcf90,in_stack_ffffffffffffcf8c);
                      boost::multiprecision::
                      number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      ::operator-=(in_stack_ffffffffffffcfb0,
                                   (self_type *)
                                   CONCAT44(in_stack_ffffffffffffcfac,in_stack_ffffffffffffcfa8));
                    }
                    else {
                      local_ec0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                *)in_stack_ffffffffffffcf90,
                                               in_stack_ffffffffffffcf8c);
                      local_eb8 = local_26d4;
                      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                                (in_stack_ffffffffffffcf90,
                                 (cpp_dec_float<50U,_int,_void> *)
                                 CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88));
                      pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)(in_RDI + 0x14);
                      local_7c0 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)(in_RDI + 0x22);
                      local_7c8 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)(in_RDI + 6);
                      local_7b8 = &local_2744;
                      boost::multiprecision::detail::
                      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                      ::
                      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                (&local_7c9,local_7c0,local_7c8);
                      local_7b0 = &local_2744;
                      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                                (in_stack_ffffffffffffcf90);
                      local_798 = &local_2744;
                      local_7a0 = local_7c0;
                      local_7a8 = local_7c8;
                      boost::multiprecision::default_ops::
                      eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                (in_stack_ffffffffffffcf90,
                                 (cpp_dec_float<50U,_int,_void> *)
                                 CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88),
                                 (cpp_dec_float<50U,_int,_void> *)0x40fe07);
                      local_1e8 = local_270c;
                      local_1f8 = &local_2744;
                      local_1f0 = pnVar11;
                      boost::multiprecision::detail::
                      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                      ::
                      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                (&local_1f9,pnVar11,local_1f8);
                      local_1e0 = local_270c;
                      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                                (in_stack_ffffffffffffcf90);
                      local_1c8 = local_270c;
                      local_1d0 = local_1f0;
                      local_1d8 = local_1f8;
                      boost::multiprecision::default_ops::
                      eval_add<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                (in_stack_ffffffffffffcf90,
                                 (cpp_dec_float<50U,_int,_void> *)
                                 CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88),
                                 (cpp_dec_float<50U,_int,_void> *)0x40febe);
                      (**(code **)(*in_RDI + 0x38))(local_277c);
                      bVar2 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                        (in_stack_ffffffffffffd080,in_stack_ffffffffffffd078,pnVar4)
                      ;
                      local_2fa5 = false;
                      if (bVar2) {
                        puVar7 = (ulong *)infinity();
                        local_27c0 = *puVar7 ^ 0x8000000000000000;
                        local_10a0 = local_27b4;
                        local_10a8 = &local_27c0;
                        local_10b0 = 0;
                        local_cb8 = local_10a8;
                        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                        cpp_dec_float<double>
                                  (in_stack_ffffffffffffcfa0,(double)in_stack_ffffffffffffcf98,
                                   in_stack_ffffffffffffcf90);
                        local_2fa5 = boost::multiprecision::operator>
                                               ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                 *)CONCAT44(in_stack_ffffffffffffcf8c,
                                                            in_stack_ffffffffffffcf88),
                                                (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                 *)0x40ffb1);
                      }
                      if (local_2fa5 == false) {
                        local_eb0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  *)in_stack_ffffffffffffcf90,
                                                 in_stack_ffffffffffffcf8c);
                        local_ea8 = local_2830;
                        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                        cpp_dec_float(in_stack_ffffffffffffcf90,
                                      (cpp_dec_float<50U,_int,_void> *)
                                      CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88))
                        ;
                        local_840 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)(in_RDI + 0x22);
                        local_848 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)(in_RDI + 0xd);
                        local_838 = &local_28a0;
                        boost::multiprecision::detail::
                        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                        ::
                        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                  (&local_849,local_840,local_848);
                        local_830 = &local_28a0;
                        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                        cpp_dec_float(in_stack_ffffffffffffcf90);
                        local_818 = &local_28a0;
                        local_820 = local_840;
                        local_828 = local_848;
                        boost::multiprecision::default_ops::
                        eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                  (in_stack_ffffffffffffcf90,
                                   (cpp_dec_float<50U,_int,_void> *)
                                   CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88),
                                   (cpp_dec_float<50U,_int,_void> *)0x410290);
                        local_228 = local_2868;
                        local_238 = &local_28a0;
                        local_230 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)(in_RDI + 0x1b);
                        boost::multiprecision::detail::
                        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                        ::
                        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                  (&local_239,
                                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)(in_RDI + 0x1b),local_238);
                        local_220 = local_2868;
                        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                        cpp_dec_float(in_stack_ffffffffffffcf90);
                        local_208 = local_2868;
                        local_210 = local_230;
                        local_218 = local_238;
                        boost::multiprecision::default_ops::
                        eval_add<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                  (in_stack_ffffffffffffcf90,
                                   (cpp_dec_float<50U,_int,_void> *)
                                   CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88),
                                   (cpp_dec_float<50U,_int,_void> *)0x410347);
                        (**(code **)(*in_RDI + 0x38))(local_28d8);
                        bVar2 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                          (in_stack_ffffffffffffd080,in_stack_ffffffffffffd078,
                                           pnVar4);
                        local_2fcd = false;
                        if (bVar2) {
                          local_1090 = infinity();
                          local_1088 = local_2910;
                          local_1098 = 0;
                          local_cc0 = local_1090;
                          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                          cpp_dec_float<double>
                                    (in_stack_ffffffffffffcfa0,(double)in_stack_ffffffffffffcf98,
                                     in_stack_ffffffffffffcf90);
                          local_2fcd = boost::multiprecision::operator<
                                                 ((
                                                  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)CONCAT44(in_stack_ffffffffffffcf8c,
                                                             in_stack_ffffffffffffcf88),
                                                  (
                                                  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)0x410410);
                        }
                        if (local_2fcd == false) {
                          local_ea0 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ::operator[]((
                                                  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  *)in_stack_ffffffffffffcf90,
                                                  in_stack_ffffffffffffcf8c);
                          local_e98 = local_29b8;
                          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                          cpp_dec_float(in_stack_ffffffffffffcf90,
                                        (cpp_dec_float<50U,_int,_void> *)
                                        CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88
                                                ));
                          local_8c0 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                       *)(in_RDI + 0x22);
                          local_8c8 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                       *)(in_RDI + 0xd);
                          local_8b8 = &local_2a28;
                          boost::multiprecision::detail::
                          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                          ::
                          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                    (&local_8c9,local_8c0,local_8c8);
                          local_8b0 = &local_2a28;
                          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                          cpp_dec_float(in_stack_ffffffffffffcf90);
                          local_898 = &local_2a28;
                          local_8a0 = local_8c0;
                          local_8a8 = local_8c8;
                          boost::multiprecision::default_ops::
                          eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                    (in_stack_ffffffffffffcf90,
                                     (cpp_dec_float<50U,_int,_void> *)
                                     CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88),
                                     (cpp_dec_float<50U,_int,_void> *)0x4107cb);
                          local_268 = local_29f0;
                          local_278 = &local_2a28;
                          local_270 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                       *)(in_RDI + 0x14);
                          boost::multiprecision::detail::
                          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                          ::
                          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                    (&local_279,
                                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)(in_RDI + 0x14),local_278);
                          local_260 = local_29f0;
                          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                          cpp_dec_float(in_stack_ffffffffffffcf90);
                          local_248 = local_29f0;
                          local_250 = local_270;
                          local_258 = local_278;
                          boost::multiprecision::default_ops::
                          eval_add<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                    (in_stack_ffffffffffffcf90,
                                     (cpp_dec_float<50U,_int,_void> *)
                                     CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88),
                                     (cpp_dec_float<50U,_int,_void> *)0x410882);
                          (**(code **)(*in_RDI + 0x38))(local_2a60);
                          bVar2 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                            (in_stack_ffffffffffffd080,in_stack_ffffffffffffd078,
                                             pnVar4);
                          tVar1 = false;
                          if (bVar2) {
                            local_1078 = infinity();
                            local_1070 = local_2a98;
                            local_1080 = 0;
                            local_cc8 = local_1078;
                            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                            cpp_dec_float<double>
                                      (in_stack_ffffffffffffcfa0,(double)in_stack_ffffffffffffcf98,
                                       in_stack_ffffffffffffcf90);
                            tVar1 = boost::multiprecision::operator<
                                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                *)CONCAT44(in_stack_ffffffffffffcf8c,
                                                           in_stack_ffffffffffffcf88),
                                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                *)0x410943);
                          }
                          if (tVar1 == false) {
                            local_e90 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        ::operator[]((
                                                  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  *)in_stack_ffffffffffffcf90,
                                                  in_stack_ffffffffffffcf8c);
                            local_e88 = local_2b08;
                            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                            cpp_dec_float(in_stack_ffffffffffffcf90,
                                          (cpp_dec_float<50U,_int,_void> *)
                                          CONCAT44(in_stack_ffffffffffffcf8c,
                                                   in_stack_ffffffffffffcf88));
                            local_940 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                         *)(in_RDI + 0x22);
                            local_948 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                         *)(in_RDI + 0xd);
                            local_938 = &local_2b78;
                            boost::multiprecision::detail::
                            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                            ::
                            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                      (&local_949,local_940,local_948);
                            local_930 = &local_2b78;
                            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                            cpp_dec_float(in_stack_ffffffffffffcf90);
                            local_918 = &local_2b78;
                            local_920 = local_940;
                            local_928 = local_948;
                            boost::multiprecision::default_ops::
                            eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                      (in_stack_ffffffffffffcf90,
                                       (cpp_dec_float<50U,_int,_void> *)
                                       CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88)
                                       ,(cpp_dec_float<50U,_int,_void> *)0x410c0a);
                            local_2a8 = local_2b40;
                            local_2b8 = &local_2b78;
                            local_2b0 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                         *)(in_RDI + 0x14);
                            boost::multiprecision::detail::
                            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                            ::
                            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                      (&local_2b9,
                                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)(in_RDI + 0x14),local_2b8);
                            local_2a0 = local_2b40;
                            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                            cpp_dec_float(in_stack_ffffffffffffcf90);
                            local_288 = local_2b40;
                            local_290 = local_2b0;
                            local_298 = local_2b8;
                            boost::multiprecision::default_ops::
                            eval_add<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                      (in_stack_ffffffffffffcf90,
                                       (cpp_dec_float<50U,_int,_void> *)
                                       CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88)
                                       ,(cpp_dec_float<50U,_int,_void> *)0x410cbe);
                            (**(code **)(*in_RDI + 0x38))(local_2bb0);
                            bVar2 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                              (in_stack_ffffffffffffd080,in_stack_ffffffffffffd078,
                                               pnVar4);
                            local_3015 = false;
                            if (bVar2) {
                              puVar7 = (ulong *)infinity();
                              local_2bf0 = *puVar7 ^ 0x8000000000000000;
                              local_1058 = local_2be8;
                              local_1060 = &local_2bf0;
                              local_1068 = 0;
                              local_cd0 = local_1060;
                              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                              cpp_dec_float<double>
                                        (in_stack_ffffffffffffcfa0,(double)in_stack_ffffffffffffcf98
                                         ,in_stack_ffffffffffffcf90);
                              local_3015 = boost::multiprecision::operator>
                                                     ((
                                                  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)CONCAT44(in_stack_ffffffffffffcf8c,
                                                             in_stack_ffffffffffffcf88),
                                                  (
                                                  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)0x410daa);
                            }
                            if (local_3015 == false) {
                              local_e80 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          ::operator[]((
                                                  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  *)in_stack_ffffffffffffcf90,
                                                  in_stack_ffffffffffffcf8c);
                              local_e78 = local_2c98;
                              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                              cpp_dec_float(in_stack_ffffffffffffcf90,
                                            (cpp_dec_float<50U,_int,_void> *)
                                            CONCAT44(in_stack_ffffffffffffcf8c,
                                                     in_stack_ffffffffffffcf88));
                              local_9c0 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                           *)(in_RDI + 0x22);
                              local_9c8 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                           *)(in_RDI + 0xd);
                              local_9b8 = &local_2d08;
                              boost::multiprecision::detail::
                              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                              ::
                              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                        (&local_9c9,local_9c0,local_9c8);
                              local_9b0 = &local_2d08;
                              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                              cpp_dec_float(in_stack_ffffffffffffcf90);
                              local_998 = &local_2d08;
                              local_9a0 = local_9c0;
                              local_9a8 = local_9c8;
                              boost::multiprecision::default_ops::
                              eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                        (in_stack_ffffffffffffcf90,
                                         (cpp_dec_float<50U,_int,_void> *)
                                         CONCAT44(in_stack_ffffffffffffcf8c,
                                                  in_stack_ffffffffffffcf88),
                                         (cpp_dec_float<50U,_int,_void> *)0x411153);
                              local_2e8 = local_2cd0;
                              local_2f8 = &local_2d08;
                              local_2f0 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                           *)(in_RDI + 0x14);
                              boost::multiprecision::detail::
                              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                              ::
                              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                        (&local_2f9,
                                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)(in_RDI + 0x14),local_2f8);
                              local_2e0 = local_2cd0;
                              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                              cpp_dec_float(in_stack_ffffffffffffcf90);
                              local_2c8 = local_2cd0;
                              local_2d0 = local_2f0;
                              local_2d8 = local_2f8;
                              boost::multiprecision::default_ops::
                              eval_add<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                        (in_stack_ffffffffffffcf90,
                                         (cpp_dec_float<50U,_int,_void> *)
                                         CONCAT44(in_stack_ffffffffffffcf8c,
                                                  in_stack_ffffffffffffcf88),
                                         (cpp_dec_float<50U,_int,_void> *)0x411207);
                              (**(code **)(*in_RDI + 0x38))(local_2d40);
                              bVar2 = LTrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                                (in_stack_ffffffffffffd080,in_stack_ffffffffffffd078
                                                 ,pnVar4);
                              if (!bVar2) {
                                local_2d9a = 1;
                                uVar6 = __cxa_allocate_exception(0x28);
                                paVar9 = &local_2d99;
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string
                                          (local_2d98,"XMAISM09 This should never happen.",paVar9);
                                SPxInternalCodeException::SPxInternalCodeException
                                          ((SPxInternalCodeException *)in_stack_ffffffffffffcf90,
                                           (string *)
                                           CONCAT44(in_stack_ffffffffffffcf8c,
                                                    in_stack_ffffffffffffcf88));
                                local_2d9a = 0;
                                __cxa_throw(uVar6,&SPxInternalCodeException::typeinfo,
                                            SPxInternalCodeException::~SPxInternalCodeException);
                              }
                              bVar2 = boost::multiprecision::operator==
                                                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)CONCAT44(in_stack_ffffffffffffcf8c,
                                                             in_stack_ffffffffffffcf88),
                                                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)0x41125b);
                              VVar8 = ON_UPPER;
                              if (bVar2) {
                                VVar8 = FIXED;
                              }
                              pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                                       ::operator[](local_1200,(int)in_RDI[5]);
                              *pVVar5 = VVar8;
                              pnVar4 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)(in_RDI + 0xd);
                              local_e18 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          ::operator[]((
                                                  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  *)in_stack_ffffffffffffcf90,
                                                  in_stack_ffffffffffffcf8c);
                              local_e20 = pnVar4;
                              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                              operator=(in_stack_ffffffffffffcf90,
                                        (cpp_dec_float<50U,_int,_void> *)
                                        CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88
                                                ));
                              local_a08 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          ::operator[]((
                                                  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  *)in_stack_ffffffffffffcf90,
                                                  in_stack_ffffffffffffcf8c);
                              local_9f8 = local_2d78;
                              local_a00 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                           *)(in_RDI + 0x22);
                              boost::multiprecision::detail::
                              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                              ::
                              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                        (&local_a09,
                                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)(in_RDI + 0x22),local_a08);
                              local_9f0 = local_2d78;
                              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                              cpp_dec_float(in_stack_ffffffffffffcf90);
                              local_9d8 = local_2d78;
                              local_9e0 = local_a00;
                              local_9e8 = local_a08;
                              boost::multiprecision::default_ops::
                              eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                        (in_stack_ffffffffffffcf90,
                                         (cpp_dec_float<50U,_int,_void> *)
                                         CONCAT44(in_stack_ffffffffffffcf8c,
                                                  in_stack_ffffffffffffcf88),
                                         (cpp_dec_float<50U,_int,_void> *)0x4113b5);
                              VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                            *)in_stack_ffffffffffffcf90,in_stack_ffffffffffffcf8c);
                              boost::multiprecision::
                              number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              ::operator-=(pnVar4,(self_type *)
                                                  CONCAT44(VVar8,in_stack_ffffffffffffcfa8));
                            }
                            else {
                              bVar2 = boost::multiprecision::operator==
                                                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)CONCAT44(in_stack_ffffffffffffcf8c,
                                                             in_stack_ffffffffffffcf88),
                                                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                  *)0x410dd9);
                              VVar8 = ON_LOWER;
                              if (bVar2) {
                                VVar8 = FIXED;
                              }
                              pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                                       ::operator[](local_1200,*(int *)((long)in_RDI + 0x2c));
                              *pVVar5 = VVar8;
                              local_e08 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          ::operator[]((
                                                  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  *)in_stack_ffffffffffffcf90,
                                                  in_stack_ffffffffffffcf8c);
                              local_e10 = in_RDI + 0x14;
                              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                              operator=(in_stack_ffffffffffffcf90,
                                        (cpp_dec_float<50U,_int,_void> *)
                                        CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88
                                                ));
                              pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                                       ::operator[](local_1200,(int)in_RDI[5]);
                              *pVVar5 = BASIC;
                              local_978 = &local_2c60;
                              local_980 = &local_1a68;
                              local_988 = &local_18f4;
                              boost::multiprecision::detail::
                              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                              ::
                              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                        (&local_989,local_980,local_988);
                              local_970 = &local_2c60;
                              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                              cpp_dec_float(in_stack_ffffffffffffcf90);
                              local_958 = &local_2c60;
                              local_960 = local_980;
                              local_968 = local_988;
                              boost::multiprecision::default_ops::
                              eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                        (in_stack_ffffffffffffcf90,
                                         (cpp_dec_float<50U,_int,_void> *)
                                         CONCAT44(in_stack_ffffffffffffcf8c,
                                                  in_stack_ffffffffffffcf88),
                                         (cpp_dec_float<50U,_int,_void> *)0x410f3b);
                              local_c48 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                           *)(in_RDI + 0x22);
                              local_c38 = local_2c28;
                              local_c40 = &local_2c60;
                              boost::multiprecision::detail::
                              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                              ::
                              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                        (&local_c49,local_c40,local_c48);
                              local_c30 = local_2c28;
                              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                              cpp_dec_float(in_stack_ffffffffffffcf90);
                              local_c18 = local_2c28;
                              local_c20 = local_c40;
                              local_c28 = local_c48;
                              boost::multiprecision::default_ops::
                              eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                        (in_stack_ffffffffffffcf90,
                                         (cpp_dec_float<50U,_int,_void> *)
                                         CONCAT44(in_stack_ffffffffffffcf8c,
                                                  in_stack_ffffffffffffcf88),
                                         (cpp_dec_float<50U,_int,_void> *)0x410ff8);
                              local_e58 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          ::operator[]((
                                                  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  *)in_stack_ffffffffffffcf90,
                                                  in_stack_ffffffffffffcf8c);
                              local_e60 = local_2c28;
                              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                              operator=(in_stack_ffffffffffffcf90,
                                        (cpp_dec_float<50U,_int,_void> *)
                                        CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88
                                                ));
                            }
                          }
                          else {
                            bVar2 = boost::multiprecision::operator==
                                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                *)CONCAT44(in_stack_ffffffffffffcf8c,
                                                           in_stack_ffffffffffffcf88),
                                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                                *)0x410972);
                            VVar8 = ON_UPPER;
                            if (bVar2) {
                              VVar8 = FIXED;
                            }
                            pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                                     ::operator[](local_1200,(int)in_RDI[5]);
                            *pVVar5 = VVar8;
                            local_df8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        ::operator[]((
                                                  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  *)in_stack_ffffffffffffcf90,
                                                  in_stack_ffffffffffffcf8c);
                            local_e00 = in_RDI + 0xd;
                            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                            operator=(in_stack_ffffffffffffcf90,
                                      (cpp_dec_float<50U,_int,_void> *)
                                      CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88))
                            ;
                            pnVar4 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)(in_RDI + 0x22);
                            local_908 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        ::operator[]((
                                                  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  *)in_stack_ffffffffffffcf90,
                                                  in_stack_ffffffffffffcf8c);
                            local_8f8 = local_2ad0;
                            local_900 = pnVar4;
                            boost::multiprecision::detail::
                            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                            ::
                            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                      (&local_909,pnVar4,local_908);
                            local_8f0 = local_2ad0;
                            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                            cpp_dec_float(in_stack_ffffffffffffcf90);
                            local_8d8 = local_2ad0;
                            local_8e0 = local_900;
                            local_8e8 = local_908;
                            boost::multiprecision::default_ops::
                            eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                      (in_stack_ffffffffffffcf90,
                                       (cpp_dec_float<50U,_int,_void> *)
                                       CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88)
                                       ,(cpp_dec_float<50U,_int,_void> *)0x410acc);
                            VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          *)in_stack_ffffffffffffcf90,in_stack_ffffffffffffcf8c);
                            boost::multiprecision::
                            number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            ::operator-=(in_stack_ffffffffffffcfb0,
                                         (self_type *)
                                         CONCAT44(in_stack_ffffffffffffcfac,
                                                  in_stack_ffffffffffffcfa8));
                          }
                        }
                        else {
                          bVar2 = boost::multiprecision::operator==
                                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                              *)CONCAT44(in_stack_ffffffffffffcf8c,
                                                         in_stack_ffffffffffffcf88),
                                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                              *)0x410445);
                          VVar8 = ON_UPPER;
                          if (bVar2) {
                            VVar8 = FIXED;
                          }
                          pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                                   ::operator[](local_1200,*(int *)((long)in_RDI + 0x2c));
                          *pVVar5 = VVar8;
                          plVar10 = in_RDI + 0x1b;
                          local_de8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ::operator[]((
                                                  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  *)in_stack_ffffffffffffcf90,
                                                  in_stack_ffffffffffffcf8c);
                          local_df0 = plVar10;
                          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                                    (in_stack_ffffffffffffcf90,
                                     (cpp_dec_float<50U,_int,_void> *)
                                     CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88));
                          pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                                   ::operator[](local_1200,(int)in_RDI[5]);
                          *pVVar5 = BASIC;
                          local_878 = &local_2980;
                          local_880 = &local_1b10;
                          local_888 = &local_199c;
                          boost::multiprecision::detail::
                          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                          ::
                          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                    (&local_889,local_880,local_888);
                          local_870 = &local_2980;
                          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                          cpp_dec_float(in_stack_ffffffffffffcf90);
                          local_858 = &local_2980;
                          local_860 = local_880;
                          local_868 = local_888;
                          boost::multiprecision::default_ops::
                          eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                    (in_stack_ffffffffffffcf90,
                                     (cpp_dec_float<50U,_int,_void> *)
                                     CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88),
                                     (cpp_dec_float<50U,_int,_void> *)0x4105b0);
                          local_c08 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                       *)(in_RDI + 0x22);
                          local_bf8 = local_2948;
                          local_c00 = &local_2980;
                          boost::multiprecision::detail::
                          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                          ::
                          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                    (&local_c09,local_c00,local_c08);
                          local_bf0 = local_2948;
                          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                          cpp_dec_float(in_stack_ffffffffffffcf90);
                          local_bd8 = local_2948;
                          local_be0 = local_c00;
                          local_be8 = local_c08;
                          boost::multiprecision::default_ops::
                          eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                    (in_stack_ffffffffffffcf90,
                                     (cpp_dec_float<50U,_int,_void> *)
                                     CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88),
                                     (cpp_dec_float<50U,_int,_void> *)0x41066d);
                          local_e48 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ::operator[]((
                                                  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  *)in_stack_ffffffffffffcf90,
                                                  in_stack_ffffffffffffcf8c);
                          local_e50 = local_2948;
                          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                                    (in_stack_ffffffffffffcf90,
                                     (cpp_dec_float<50U,_int,_void> *)
                                     CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88));
                        }
                      }
                      else {
                        bVar2 = boost::multiprecision::operator==
                                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                            *)CONCAT44(in_stack_ffffffffffffcf8c,
                                                       in_stack_ffffffffffffcf88),
                                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                            *)0x40ffe0);
                        VVar8 = ON_LOWER;
                        if (bVar2) {
                          VVar8 = FIXED;
                        }
                        pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                                 ::operator[](local_1200,(int)in_RDI[5]);
                        *pVVar5 = VVar8;
                        local_dd8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  *)in_stack_ffffffffffffcf90,
                                                 in_stack_ffffffffffffcf8c);
                        local_de0 = in_RDI + 6;
                        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                                  (in_stack_ffffffffffffcf90,
                                   (cpp_dec_float<50U,_int,_void> *)
                                   CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88));
                        pnVar4 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)(in_RDI + 0x22);
                        local_808 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  *)in_stack_ffffffffffffcf90,
                                                 in_stack_ffffffffffffcf8c);
                        local_7f8 = local_27f8;
                        local_800 = pnVar4;
                        boost::multiprecision::detail::
                        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
                        ::
                        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                  (&local_809,pnVar4,local_808);
                        local_7f0 = local_27f8;
                        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                        cpp_dec_float(in_stack_ffffffffffffcf90);
                        local_7d8 = local_27f8;
                        local_7e0 = local_800;
                        local_7e8 = local_808;
                        boost::multiprecision::default_ops::
                        eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                  (in_stack_ffffffffffffcf90,
                                   (cpp_dec_float<50U,_int,_void> *)
                                   CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88),
                                   (cpp_dec_float<50U,_int,_void> *)0x41014f);
                        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)in_stack_ffffffffffffcf90,in_stack_ffffffffffffcf8c);
                        boost::multiprecision::
                        number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        ::operator-=(in_stack_ffffffffffffcfb0,
                                     (self_type *)
                                     CONCAT44(in_stack_ffffffffffffcfac,in_stack_ffffffffffffcfa8));
                      }
                    }
                  }
                }
                else {
                  pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                           ::operator[](local_1200,(int)in_RDI[5]);
                  *pVVar5 = ZERO;
                  local_1d68 = 0;
                  local_408 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                            *)in_stack_ffffffffffffcf90,in_stack_ffffffffffffcf8c);
                  local_410 = &local_1d68;
                  local_400 = local_410;
                  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                            (in_stack_ffffffffffffd018,
                             (double)CONCAT44(in_stack_ffffffffffffd014,in_stack_ffffffffffffd010));
                }
              }
            }
          }
        }
      }
      this_00 = (cpp_dec_float<50U,_int,_void> *)(in_RDI + 0x22);
      local_a48 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)this_00,in_stack_ffffffffffffcf8c);
      local_a38 = local_2dd4;
      local_a40 = this_00;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_a49,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)this_00,local_a48);
      local_a30 = local_2dd4;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float(this_00);
      local_a18 = local_2dd4;
      local_a20 = local_a40;
      local_a28 = local_a48;
      boost::multiprecision::default_ops::
      eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (this_00,(cpp_dec_float<50U,_int,_void> *)
                         CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88),
                 (cpp_dec_float<50U,_int,_void> *)0x4115a9);
      local_e68 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)this_00,in_stack_ffffffffffffcf8c);
      local_e70 = local_2dd4;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (this_00,(cpp_dec_float<50U,_int,_void> *)
                         CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88));
    }
    else {
      local_1208 = DataArray<int>::size((DataArray<int> *)(in_RDI + 0x2a));
      while (local_1208 = local_1208 + -1, -1 < local_1208) {
        piVar3 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x2a),local_1208);
        if (-1 < *piVar3) {
          piVar3 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x2a),local_1208);
          local_120c = *piVar3;
          local_1210 = local_1208;
          pnVar4 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)in_stack_ffffffffffffcf90,in_stack_ffffffffffffcf8c);
          local_cd8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)in_stack_ffffffffffffcf90,in_stack_ffffffffffffcf8c);
          local_ce0 = pnVar4;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    (in_stack_ffffffffffffcf90,
                     (cpp_dec_float<50U,_int,_void> *)
                     CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88));
          pnVar4 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)in_stack_ffffffffffffcf90,in_stack_ffffffffffffcf8c);
          local_ce8 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)in_stack_ffffffffffffcf90,in_stack_ffffffffffffcf8c);
          local_cf0 = pnVar4;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    (in_stack_ffffffffffffcf90,
                     (cpp_dec_float<50U,_int,_void> *)
                     CONCAT44(in_stack_ffffffffffffcf8c,in_stack_ffffffffffffcf88));
          pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   ::operator[](local_1200,local_120c);
          VVar8 = *pVVar5;
          pVVar5 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   ::operator[](local_1200,local_1210);
          *pVVar5 = VVar8;
        }
      }
    }
  }
  return;
}

Assistant:

void SPxMainSM<R>::DuplicateColsPS::execute(VectorBase<R>& x,
      VectorBase<R>&,
      VectorBase<R>&,
      VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{

   if(m_isFirst)
   {
#ifdef SOPLEX_CHECK_BASIS_DIM

      if(!this->checkBasisDim(rStatus, cStatus))
      {
         throw SPxInternalCodeException("XMAISM25 Dimension doesn't match after this step.");
      }

#endif
      return;
   }


   // correcting the change of idx by deletion of the columns:
   if(m_isLast)
   {
      for(int i = m_perm.size() - 1; i >= 0; --i)
      {
         if(m_perm[i] >= 0)
         {
            int cIdx_new = m_perm[i];
            int cIdx = i;
            x[cIdx] = x[cIdx_new];
            r[cIdx] = r[cIdx_new];
            cStatus[cIdx] = cStatus[cIdx_new];
         }
      }

      return;
   }

   // primal & basis:
   SOPLEX_ASSERT_WARN("WMAISM03", isNotZero(m_scale, this->epsilon()));

   if(cStatus[m_k] == SPxSolverBase<R>::ON_LOWER)
   {
      x[m_k] = m_loK;

      if(m_scale > 0)
      {
         x[m_j]       = m_loJ;
         cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
      }
      else
      {
         x[m_j]       = m_upJ;
         cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
      }
   }
   else if(cStatus[m_k] == SPxSolverBase<R>::ON_UPPER)
   {
      x[m_k] = m_upK;

      if(m_scale > 0)
      {
         x[m_j]       = m_upJ;
         cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
      }
      else
      {
         x[m_j]       = m_loJ;
         cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
      }
   }
   else if(cStatus[m_k] == SPxSolverBase<R>::FIXED)
   {
      // => x[m_k] and x[m_j] are also fixed before the corresponding preprocessing step
      x[m_j]       = m_loJ;
      cStatus[m_j] = SPxSolverBase<R>::FIXED;
   }
   else if(cStatus[m_k] == SPxSolverBase<R>::ZERO)
   {
      /* we only aggregate duplicate columns if 0 is contained in their bounds, so we can handle this case properly */
      assert(isZero(x[m_k], this->epsilon()));
      assert(LErel(m_loJ, R(0.0), this->epsilon()));
      assert(GErel(m_upJ, R(0.0), this->epsilon()));
      assert(LErel(m_loK, R(0.0), this->epsilon()));
      assert(GErel(m_upK, R(0.0), this->epsilon()));

      if(isZero(m_loK, this->epsilon()) && isZero(m_upK, this->epsilon()) && m_loK == m_upK)
         cStatus[m_k] = SPxSolverBase<R>::FIXED;
      else if(isZero(m_loK, this->epsilon()))
         cStatus[m_k] = SPxSolverBase<R>::ON_LOWER;
      else if(isZero(m_upK, this->epsilon()))
         cStatus[m_k] = SPxSolverBase<R>::ON_UPPER;
      else if(LErel(m_loK, R(0.0), this->epsilon()) && GErel(m_upK, R(0.0), this->epsilon()))
         cStatus[m_k] = SPxSolverBase<R>::ZERO;
      else
         throw SPxInternalCodeException("XMAISM05 This should never happen.");

      x[m_j] = 0.0;

      if(isZero(m_loJ, this->epsilon()) && isZero(m_upJ, this->epsilon()) && m_loJ == m_upJ)
         cStatus[m_j] = SPxSolverBase<R>::FIXED;
      else if(isZero(m_loJ, this->epsilon()))
         cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
      else if(isZero(m_upJ, this->epsilon()))
         cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
      else if(LErel(m_loJ, R(0.0), this->epsilon()) && GErel(m_upJ, R(0.0), this->epsilon()))
         cStatus[m_j] = SPxSolverBase<R>::ZERO;
      else
         throw SPxInternalCodeException("XMAISM06 This should never happen.");
   }
   else if(cStatus[m_k] == SPxSolverBase<R>::BASIC)
   {
      R scale1 = maxAbs(x[m_k], m_loK);
      R scale2 = maxAbs(x[m_k], m_upK);

      if(scale1 < 1.0)
         scale1 = 1.0;

      if(scale2 < 1.0)
         scale2 = 1.0;

      R z1 = (x[m_k] / scale1) - (m_loK / scale1);
      R z2 = (x[m_k] / scale2) - (m_upK / scale2);

      if(isZero(z1, this->epsilon()))
         z1 = 0.0;

      if(isZero(z2, this->epsilon()))
         z2 = 0.0;

      if(m_loJ <= R(-infinity) && m_upJ >= R(infinity) && m_loK <= R(-infinity) && m_upK >= R(infinity))
      {
         cStatus[m_j] = SPxSolverBase<R>::ZERO;
         x[m_j] = 0.0;
      }
      else if(m_scale > 0.0)
      {
         if(GErel(x[m_k], m_upK + m_scale * m_upJ, this->epsilon()))
         {
            assert(m_upJ < R(infinity));
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_j] = m_upJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_upJ, this->epsilon()) && m_upJ < R(infinity))
         {
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_j] = m_upJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_upK + m_scale * m_loJ, this->epsilon()) && m_upK < R(infinity))
         {
            cStatus[m_k] = (m_loK == m_upK) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_k] = m_upK;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            x[m_j] = z2 * scale2 / m_scale;
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_loJ, this->epsilon()) && m_loJ > R(-infinity))
         {
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_j] = m_loJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_loJ, this->epsilon()) && m_loK > R(-infinity))
         {
            cStatus[m_k] = (m_loK == m_upK) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_k] = m_loK;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            x[m_j] = z1 * scale1 / m_scale;
         }
         else if(LTrel(x[m_k], m_loK + m_scale * m_loJ, this->epsilon()))
         {
            assert(m_loJ > R(-infinity));
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_j] = m_loJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else
         {
            throw SPxInternalCodeException("XMAISM08 This should never happen.");
         }
      }
      else
      {
         assert(m_scale < 0.0);

         if(GErel(x[m_k], m_upK + m_scale * m_loJ, this->epsilon()))
         {
            assert(m_loJ > R(-infinity));
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_j] = m_loJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_loJ, this->epsilon()) && m_loJ > R(-infinity))
         {
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_j] = m_loJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_upK + m_scale * m_upJ, this->epsilon()) && m_upK < R(infinity))
         {
            cStatus[m_k] = (m_loK == m_upK) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_k] = m_upK;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            x[m_j] = z2 * scale2 / m_scale;
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_upJ, this->epsilon()) && m_upJ < R(infinity))
         {
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_j] = m_upJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_upJ, this->epsilon()) && m_loK > R(-infinity))
         {
            cStatus[m_k] = (m_loK == m_upK) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_k] = m_loK;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            x[m_j] = z1 * scale1 / m_scale;
         }
         else if(LTrel(x[m_k], m_loK + m_scale * m_upJ, this->epsilon()))
         {
            assert(m_upJ < R(infinity));
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_j] = m_upJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else
         {
            throw SPxInternalCodeException("XMAISM09 This should never happen.");
         }
      }
   }

   // dual:
   r[m_j] = m_scale * r[m_k];
}